

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined8 *puVar3;
  float *pfVar4;
  undefined8 uVar5;
  ulong uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  uint uVar67;
  long lVar68;
  ulong uVar69;
  byte bVar71;
  uint uVar72;
  long lVar73;
  undefined4 uVar74;
  bool bVar75;
  float fVar76;
  vint4 bi;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar95 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar152;
  float fVar153;
  vint4 bi_2;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar154;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar128 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar155;
  vint4 bi_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar192;
  float fVar213;
  float fVar214;
  vint4 ai_1;
  undefined1 auVar193 [16];
  float fVar215;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  float fVar216;
  float fVar239;
  float fVar240;
  vint4 ai_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar241;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  vint4 ai;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar267;
  float fVar276;
  float fVar277;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar278;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  vfloat4 a0_1;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar303;
  float fVar314;
  float fVar315;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar316;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  float fVar317;
  float fVar328;
  float fVar329;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar330;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [64];
  float fVar331;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar349;
  float fVar350;
  float fVar360;
  float fVar361;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  float fVar362;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar363;
  float fVar364;
  float fVar368;
  float fVar370;
  vfloat4 a0;
  float fVar373;
  undefined1 auVar365 [16];
  float fVar372;
  undefined1 auVar366 [16];
  float fVar369;
  float fVar371;
  float fVar374;
  undefined1 auVar367 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  uint auStack_4b0 [4];
  RTCFilterFunctionNArguments local_4a0;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar70;
  undefined1 auVar266 [32];
  undefined1 auVar359 [32];
  
  PVar7 = prim[1];
  uVar66 = (ulong)(byte)PVar7;
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  lVar68 = uVar66 * 0x25;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x11 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar199 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar199 = vinsertps_avx(auVar199,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar267 = *(float *)(prim + lVar68 + 0x12);
  auVar88 = vsubps_avx(auVar88,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar268._0_4_ = fVar267 * auVar88._0_4_;
  auVar268._4_4_ = fVar267 * auVar88._4_4_;
  auVar268._8_4_ = fVar267 * auVar88._8_4_;
  auVar268._12_4_ = fVar267 * auVar88._12_4_;
  auVar351._0_4_ = fVar267 * auVar199._0_4_;
  auVar351._4_4_ = fVar267 * auVar199._4_4_;
  auVar351._8_4_ = fVar267 * auVar199._8_4_;
  auVar351._12_4_ = fVar267 * auVar199._12_4_;
  auVar168 = vcvtdq2ps_avx(auVar187);
  auVar142 = vcvtdq2ps_avx(auVar282);
  auVar130 = vcvtdq2ps_avx(auVar15);
  auVar173 = vcvtdq2ps_avx(auVar173);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar272 = vcvtdq2ps_avx(auVar272);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar88 = vshufps_avx(auVar351,auVar351,0);
  auVar199 = vshufps_avx(auVar351,auVar351,0x55);
  auVar187 = vshufps_avx(auVar351,auVar351,0xaa);
  fVar267 = auVar187._0_4_;
  fVar277 = auVar187._4_4_;
  fVar192 = auVar187._8_4_;
  fVar214 = auVar187._12_4_;
  fVar276 = auVar199._0_4_;
  fVar278 = auVar199._4_4_;
  fVar213 = auVar199._8_4_;
  fVar215 = auVar199._12_4_;
  fVar216 = auVar88._0_4_;
  fVar239 = auVar88._4_4_;
  fVar240 = auVar88._8_4_;
  fVar241 = auVar88._12_4_;
  auVar217._0_4_ = fVar216 * auVar168._0_4_ + auVar142._0_4_ * fVar276 + auVar130._0_4_ * fVar267;
  auVar217._4_4_ = fVar239 * auVar168._4_4_ + auVar142._4_4_ * fVar278 + auVar130._4_4_ * fVar277;
  auVar217._8_4_ = fVar240 * auVar168._8_4_ + auVar142._8_4_ * fVar213 + auVar130._8_4_ * fVar192;
  auVar217._12_4_ =
       fVar241 * auVar168._12_4_ + auVar142._12_4_ * fVar215 + auVar130._12_4_ * fVar214;
  auVar193._0_4_ = fVar216 * auVar173._0_4_ + auVar131._0_4_ * fVar276 + auVar87._0_4_ * fVar267;
  auVar193._4_4_ = fVar239 * auVar173._4_4_ + auVar131._4_4_ * fVar278 + auVar87._4_4_ * fVar277;
  auVar193._8_4_ = fVar240 * auVar173._8_4_ + auVar131._8_4_ * fVar213 + auVar87._8_4_ * fVar192;
  auVar193._12_4_ = fVar241 * auVar173._12_4_ + auVar131._12_4_ * fVar215 + auVar87._12_4_ * fVar214
  ;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar118 = vpmovsxwd_avx(auVar88);
  auVar88 = vcvtdq2ps_avx(auVar79);
  auVar318._0_4_ = fVar216 * auVar88._0_4_ + auVar272._0_4_ * fVar276 + auVar78._0_4_ * fVar267;
  auVar318._4_4_ = fVar239 * auVar88._4_4_ + auVar272._4_4_ * fVar278 + auVar78._4_4_ * fVar277;
  auVar318._8_4_ = fVar240 * auVar88._8_4_ + auVar272._8_4_ * fVar213 + auVar78._8_4_ * fVar192;
  auVar318._12_4_ = fVar241 * auVar88._12_4_ + auVar272._12_4_ * fVar215 + auVar78._12_4_ * fVar214;
  auVar199 = vshufps_avx(auVar268,auVar268,0xaa);
  fVar267 = auVar199._0_4_;
  fVar277 = auVar199._4_4_;
  fVar192 = auVar199._8_4_;
  fVar214 = auVar199._12_4_;
  auVar199 = vshufps_avx(auVar268,auVar268,0x55);
  fVar276 = auVar199._0_4_;
  fVar278 = auVar199._4_4_;
  fVar213 = auVar199._8_4_;
  fVar215 = auVar199._12_4_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar79 = vpmovsxwd_avx(auVar199);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar157 = vpmovsxwd_avx(auVar187);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar282 = vpmovsxwd_avx(auVar282);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar199 = vshufps_avx(auVar268,auVar268,0);
  fVar216 = auVar199._0_4_;
  fVar239 = auVar199._4_4_;
  fVar240 = auVar199._8_4_;
  fVar241 = auVar199._12_4_;
  auVar77._0_4_ = fVar216 * auVar168._0_4_ + auVar142._0_4_ * fVar276 + auVar130._0_4_ * fVar267;
  auVar77._4_4_ = fVar239 * auVar168._4_4_ + auVar142._4_4_ * fVar278 + auVar130._4_4_ * fVar277;
  auVar77._8_4_ = fVar240 * auVar168._8_4_ + auVar142._8_4_ * fVar213 + auVar130._8_4_ * fVar192;
  auVar77._12_4_ = fVar241 * auVar168._12_4_ + auVar142._12_4_ * fVar215 + auVar130._12_4_ * fVar214
  ;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar66 * 0x16 + 6);
  auVar168 = vpmovsxwd_avx(auVar168);
  auVar156._0_4_ = auVar131._0_4_ * fVar276 + auVar87._0_4_ * fVar267 + fVar216 * auVar173._0_4_;
  auVar156._4_4_ = auVar131._4_4_ * fVar278 + auVar87._4_4_ * fVar277 + fVar239 * auVar173._4_4_;
  auVar156._8_4_ = auVar131._8_4_ * fVar213 + auVar87._8_4_ * fVar192 + fVar240 * auVar173._8_4_;
  auVar156._12_4_ = auVar131._12_4_ * fVar215 + auVar87._12_4_ * fVar214 + fVar241 * auVar173._12_4_
  ;
  auVar117._0_4_ = auVar88._0_4_ * fVar216 + auVar272._0_4_ * fVar276 + auVar78._0_4_ * fVar267;
  auVar117._4_4_ = auVar88._4_4_ * fVar239 + auVar272._4_4_ * fVar278 + auVar78._4_4_ * fVar277;
  auVar117._8_4_ = auVar88._8_4_ * fVar240 + auVar272._8_4_ * fVar213 + auVar78._8_4_ * fVar192;
  auVar117._12_4_ = auVar88._12_4_ * fVar241 + auVar272._12_4_ * fVar215 + auVar78._12_4_ * fVar214;
  auVar352._8_4_ = 0x7fffffff;
  auVar352._0_8_ = 0x7fffffff7fffffff;
  auVar352._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar352,auVar217);
  auVar304._8_4_ = 0x219392ef;
  auVar304._0_8_ = 0x219392ef219392ef;
  auVar304._12_4_ = 0x219392ef;
  auVar88 = vcmpps_avx(auVar88,auVar304,1);
  auVar199 = vblendvps_avx(auVar217,auVar304,auVar88);
  auVar88 = vandps_avx(auVar352,auVar193);
  auVar88 = vcmpps_avx(auVar88,auVar304,1);
  auVar187 = vblendvps_avx(auVar193,auVar304,auVar88);
  auVar88 = vandps_avx(auVar318,auVar352);
  auVar88 = vcmpps_avx(auVar88,auVar304,1);
  auVar88 = vblendvps_avx(auVar318,auVar304,auVar88);
  auVar142 = vrcpps_avx(auVar199);
  fVar192 = auVar142._0_4_;
  auVar218._0_4_ = fVar192 * auVar199._0_4_;
  fVar213 = auVar142._4_4_;
  auVar218._4_4_ = fVar213 * auVar199._4_4_;
  fVar214 = auVar142._8_4_;
  auVar218._8_4_ = fVar214 * auVar199._8_4_;
  fVar215 = auVar142._12_4_;
  auVar218._12_4_ = fVar215 * auVar199._12_4_;
  auVar319._8_4_ = 0x3f800000;
  auVar319._0_8_ = 0x3f8000003f800000;
  auVar319._12_4_ = 0x3f800000;
  auVar199 = vsubps_avx(auVar319,auVar218);
  fVar192 = fVar192 + fVar192 * auVar199._0_4_;
  fVar213 = fVar213 + fVar213 * auVar199._4_4_;
  fVar214 = fVar214 + fVar214 * auVar199._8_4_;
  fVar215 = fVar215 + fVar215 * auVar199._12_4_;
  auVar199 = vrcpps_avx(auVar187);
  fVar216 = auVar199._0_4_;
  auVar269._0_4_ = fVar216 * auVar187._0_4_;
  fVar239 = auVar199._4_4_;
  auVar269._4_4_ = fVar239 * auVar187._4_4_;
  fVar240 = auVar199._8_4_;
  auVar269._8_4_ = fVar240 * auVar187._8_4_;
  fVar241 = auVar199._12_4_;
  auVar269._12_4_ = fVar241 * auVar187._12_4_;
  auVar199 = vsubps_avx(auVar319,auVar269);
  fVar216 = fVar216 + fVar216 * auVar199._0_4_;
  fVar239 = fVar239 + fVar239 * auVar199._4_4_;
  fVar240 = fVar240 + fVar240 * auVar199._8_4_;
  fVar241 = fVar241 + fVar241 * auVar199._12_4_;
  auVar199 = vrcpps_avx(auVar88);
  fVar267 = auVar199._0_4_;
  auVar305._0_4_ = auVar88._0_4_ * fVar267;
  fVar276 = auVar199._4_4_;
  auVar305._4_4_ = auVar88._4_4_ * fVar276;
  fVar277 = auVar199._8_4_;
  auVar305._8_4_ = auVar88._8_4_ * fVar277;
  fVar278 = auVar199._12_4_;
  auVar305._12_4_ = auVar88._12_4_ * fVar278;
  auVar88 = vsubps_avx(auVar319,auVar305);
  fVar267 = auVar88._0_4_ * fVar267 + fVar267;
  fVar276 = auVar88._4_4_ * fVar276 + fVar276;
  fVar277 = auVar88._8_4_ * fVar277 + fVar277;
  fVar278 = auVar88._12_4_ * fVar278 + fVar278;
  auVar88 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar68 + 0x16)) *
                          *(float *)(prim + lVar68 + 0x1a)));
  auVar187 = vshufps_avx(auVar88,auVar88,0);
  auVar88 = vcvtdq2ps_avx(auVar118);
  auVar199 = vcvtdq2ps_avx(auVar79);
  auVar199 = vsubps_avx(auVar199,auVar88);
  fVar152 = auVar187._0_4_;
  fVar153 = auVar187._4_4_;
  fVar76 = auVar187._8_4_;
  fVar154 = auVar187._12_4_;
  auVar242._0_4_ = fVar152 * auVar199._0_4_ + auVar88._0_4_;
  auVar242._4_4_ = fVar153 * auVar199._4_4_ + auVar88._4_4_;
  auVar242._8_4_ = fVar76 * auVar199._8_4_ + auVar88._8_4_;
  auVar242._12_4_ = fVar154 * auVar199._12_4_ + auVar88._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar157);
  auVar199 = vcvtdq2ps_avx(auVar282);
  auVar199 = vsubps_avx(auVar199,auVar88);
  auVar255._0_4_ = fVar152 * auVar199._0_4_ + auVar88._0_4_;
  auVar255._4_4_ = fVar153 * auVar199._4_4_ + auVar88._4_4_;
  auVar255._8_4_ = fVar76 * auVar199._8_4_ + auVar88._8_4_;
  auVar255._12_4_ = fVar154 * auVar199._12_4_ + auVar88._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar15);
  auVar199 = vcvtdq2ps_avx(auVar168);
  auVar187 = vsubps_avx(auVar199,auVar88);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar199 = vpmovsxwd_avx(auVar142);
  auVar279._0_4_ = fVar152 * auVar187._0_4_ + auVar88._0_4_;
  auVar279._4_4_ = fVar153 * auVar187._4_4_ + auVar88._4_4_;
  auVar279._8_4_ = fVar76 * auVar187._8_4_ + auVar88._8_4_;
  auVar279._12_4_ = fVar154 * auVar187._12_4_ + auVar88._12_4_;
  auVar88 = vcvtdq2ps_avx(auVar199);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar199 = vpmovsxwd_avx(auVar130);
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar199 = vsubps_avx(auVar199,auVar88);
  auVar293._0_4_ = fVar152 * auVar199._0_4_ + auVar88._0_4_;
  auVar293._4_4_ = fVar153 * auVar199._4_4_ + auVar88._4_4_;
  auVar293._8_4_ = fVar76 * auVar199._8_4_ + auVar88._8_4_;
  auVar293._12_4_ = fVar154 * auVar199._12_4_ + auVar88._12_4_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar88 = vpmovsxwd_avx(auVar173);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar66 * 0x21 + 6);
  auVar199 = vpmovsxwd_avx(auVar131);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar199 = vsubps_avx(auVar199,auVar88);
  auVar306._0_4_ = fVar152 * auVar199._0_4_ + auVar88._0_4_;
  auVar306._4_4_ = fVar153 * auVar199._4_4_ + auVar88._4_4_;
  auVar306._8_4_ = fVar76 * auVar199._8_4_ + auVar88._8_4_;
  auVar306._12_4_ = fVar154 * auVar199._12_4_ + auVar88._12_4_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar66 * 0x1f + 6);
  auVar88 = vpmovsxwd_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar199 = vpmovsxwd_avx(auVar272);
  auVar199 = vcvtdq2ps_avx(auVar199);
  auVar199 = vsubps_avx(auVar199,auVar88);
  auVar320._0_4_ = fVar152 * auVar199._0_4_ + auVar88._0_4_;
  auVar320._4_4_ = fVar153 * auVar199._4_4_ + auVar88._4_4_;
  auVar320._8_4_ = fVar76 * auVar199._8_4_ + auVar88._8_4_;
  auVar320._12_4_ = fVar154 * auVar199._12_4_ + auVar88._12_4_;
  auVar88 = vsubps_avx(auVar242,auVar77);
  auVar243._0_4_ = fVar192 * auVar88._0_4_;
  auVar243._4_4_ = fVar213 * auVar88._4_4_;
  auVar243._8_4_ = fVar214 * auVar88._8_4_;
  auVar243._12_4_ = fVar215 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar255,auVar77);
  auVar78._0_4_ = fVar192 * auVar88._0_4_;
  auVar78._4_4_ = fVar213 * auVar88._4_4_;
  auVar78._8_4_ = fVar214 * auVar88._8_4_;
  auVar78._12_4_ = fVar215 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar279,auVar156);
  auVar194._0_4_ = fVar216 * auVar88._0_4_;
  auVar194._4_4_ = fVar239 * auVar88._4_4_;
  auVar194._8_4_ = fVar240 * auVar88._8_4_;
  auVar194._12_4_ = fVar241 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar293,auVar156);
  auVar157._0_4_ = fVar216 * auVar88._0_4_;
  auVar157._4_4_ = fVar239 * auVar88._4_4_;
  auVar157._8_4_ = fVar240 * auVar88._8_4_;
  auVar157._12_4_ = fVar241 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar306,auVar117);
  auVar219._0_4_ = fVar267 * auVar88._0_4_;
  auVar219._4_4_ = fVar276 * auVar88._4_4_;
  auVar219._8_4_ = fVar277 * auVar88._8_4_;
  auVar219._12_4_ = fVar278 * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar320,auVar117);
  auVar118._0_4_ = fVar267 * auVar88._0_4_;
  auVar118._4_4_ = fVar276 * auVar88._4_4_;
  auVar118._8_4_ = fVar277 * auVar88._8_4_;
  auVar118._12_4_ = fVar278 * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar243,auVar78);
  auVar199 = vpminsd_avx(auVar194,auVar157);
  auVar88 = vmaxps_avx(auVar88,auVar199);
  auVar199 = vpminsd_avx(auVar219,auVar118);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar280._4_4_ = uVar74;
  auVar280._0_4_ = uVar74;
  auVar280._8_4_ = uVar74;
  auVar280._12_4_ = uVar74;
  auVar199 = vmaxps_avx(auVar199,auVar280);
  auVar88 = vmaxps_avx(auVar88,auVar199);
  local_430._0_4_ = auVar88._0_4_ * 0.99999964;
  local_430._4_4_ = auVar88._4_4_ * 0.99999964;
  local_430._8_4_ = auVar88._8_4_ * 0.99999964;
  local_430._12_4_ = auVar88._12_4_ * 0.99999964;
  auVar88 = vpmaxsd_avx(auVar243,auVar78);
  auVar199 = vpmaxsd_avx(auVar194,auVar157);
  auVar88 = vminps_avx(auVar88,auVar199);
  auVar199 = vpmaxsd_avx(auVar219,auVar118);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar158._4_4_ = uVar74;
  auVar158._0_4_ = uVar74;
  auVar158._8_4_ = uVar74;
  auVar158._12_4_ = uVar74;
  auVar199 = vminps_avx(auVar199,auVar158);
  auVar88 = vminps_avx(auVar88,auVar199);
  auVar79._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar88 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar199 = vpcmpgtd_avx(auVar88,_DAT_01f4ad30);
  auVar88 = vcmpps_avx(local_430,auVar79,2);
  auVar88 = vandps_avx(auVar88,auVar199);
  uVar74 = vmovmskps_avx(auVar88);
  uVar66 = CONCAT44((int)((ulong)prim >> 0x20),uVar74);
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  uVar72 = 1 << ((byte)k & 0x1f);
  auVar53 = ZEXT412(0);
LAB_0091eb94:
  auVar55._12_4_ = 0;
  auVar55._0_12_ = auVar53;
  if (uVar66 == 0) {
LAB_00920f27:
    return uVar66 != 0;
  }
  lVar68 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar65 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar65].ptr;
  fVar267 = (pGVar8->time_range).lower;
  fVar216 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar267) / ((pGVar8->time_range).upper - fVar267));
  auVar88 = vroundss_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),9);
  auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar187 = vmaxss_avx(auVar55 << 0x20,auVar88);
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar68 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar73 = (long)(int)auVar187._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar73);
  pfVar2 = (float *)(*(long *)(_Var9 + lVar73) + lVar10 * uVar69);
  fVar239 = *pfVar2;
  fVar240 = pfVar2[1];
  fVar241 = pfVar2[2];
  fVar152 = pfVar2[3];
  lVar1 = uVar69 + 1;
  auVar88 = *(undefined1 (*) [16])(*(long *)(_Var9 + lVar73) + lVar10 * lVar1);
  p_Var11 = pGVar8[4].occlusionFilterN;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar10 + 0x10 + lVar73);
  pfVar2 = (float *)(*(long *)(lVar10 + lVar73) + lVar12 * uVar69);
  fVar153 = *pfVar2;
  fVar76 = pfVar2[1];
  fVar154 = pfVar2[2];
  fVar155 = pfVar2[3];
  auVar199 = *(undefined1 (*) [16])(*(long *)(lVar10 + lVar73) + lVar12 * lVar1);
  _Var13 = pGVar8[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar4 = (float *)(*(long *)(p_Var11 + lVar73) + *(long *)(p_Var11 + lVar73 + 0x10) * uVar69);
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar73) + *(long *)(p_Var11 + lVar73 + 0x10) * lVar1);
  auVar270._0_4_ = *pfVar2 * 0.33333334;
  auVar270._4_4_ = pfVar2[1] * 0.33333334;
  auVar270._8_4_ = pfVar2[2] * 0.33333334;
  auVar270._12_4_ = pfVar2[3] * 0.33333334;
  lVar12 = *(long *)(_Var13 + 0x10 + lVar73);
  pfVar2 = (float *)(*(long *)(_Var13 + lVar73) + lVar12 * uVar69);
  fVar216 = fVar216 - auVar187._0_4_;
  fVar317 = fVar239 + *pfVar4 * 0.33333334;
  fVar328 = fVar240 + pfVar4[1] * 0.33333334;
  fVar329 = fVar241 + pfVar4[2] * 0.33333334;
  fVar330 = fVar152 + pfVar4[3] * 0.33333334;
  auVar187 = vsubps_avx(auVar88,auVar270);
  fVar303 = *pfVar2 * 0.33333334 + fVar153;
  fVar314 = pfVar2[1] * 0.33333334 + fVar76;
  fVar315 = pfVar2[2] * 0.33333334 + fVar154;
  fVar316 = pfVar2[3] * 0.33333334 + fVar155;
  pfVar2 = (float *)(*(long *)(_Var13 + lVar73) + lVar12 * lVar1);
  auVar80._0_4_ = *pfVar2 * 0.33333334;
  auVar80._4_4_ = pfVar2[1] * 0.33333334;
  auVar80._8_4_ = pfVar2[2] * 0.33333334;
  auVar80._12_4_ = pfVar2[3] * 0.33333334;
  auVar282 = vsubps_avx(auVar199,auVar80);
  fVar267 = auVar88._0_4_;
  fVar277 = auVar88._4_4_;
  fVar192 = auVar88._8_4_;
  fVar214 = auVar88._12_4_;
  fVar331 = auVar187._0_4_ * 0.0;
  fVar335 = auVar187._4_4_ * 0.0;
  fVar336 = auVar187._8_4_ * 0.0;
  fVar337 = auVar187._12_4_ * 0.0;
  fVar350 = fVar331 + fVar267 * 0.0;
  fVar360 = fVar335 + fVar277 * 0.0;
  fVar361 = fVar336 + fVar192 * 0.0;
  fVar362 = fVar337 + fVar214 * 0.0;
  auVar81._0_4_ = fVar350 + fVar317 * 3.0;
  auVar81._4_4_ = fVar360 + fVar328 * 3.0;
  auVar81._8_4_ = fVar361 + fVar329 * 3.0;
  auVar81._12_4_ = fVar362 + fVar330 * 3.0;
  auVar119._0_4_ = fVar239 * 3.0;
  auVar119._4_4_ = fVar240 * 3.0;
  auVar119._8_4_ = fVar241 * 3.0;
  auVar119._12_4_ = fVar152 * 3.0;
  auVar130 = vsubps_avx(auVar81,auVar119);
  fVar276 = auVar199._0_4_;
  fVar278 = auVar199._4_4_;
  fVar213 = auVar199._8_4_;
  fVar215 = auVar199._12_4_;
  fVar342 = auVar282._0_4_ * 0.0;
  fVar346 = auVar282._4_4_ * 0.0;
  fVar347 = auVar282._8_4_ * 0.0;
  fVar348 = auVar282._12_4_ * 0.0;
  fVar363 = fVar342 + fVar276 * 0.0;
  fVar368 = fVar346 + fVar278 * 0.0;
  fVar370 = fVar347 + fVar213 * 0.0;
  fVar373 = fVar348 + fVar215 * 0.0;
  auVar82._0_4_ = fVar363 + fVar303 * 3.0;
  auVar82._4_4_ = fVar368 + fVar314 * 3.0;
  auVar82._8_4_ = fVar370 + fVar315 * 3.0;
  auVar82._12_4_ = fVar373 + fVar316 * 3.0;
  auVar281._0_4_ = fVar153 * 3.0;
  auVar281._4_4_ = fVar76 * 3.0;
  auVar281._8_4_ = fVar154 * 3.0;
  auVar281._12_4_ = fVar155 * 3.0;
  auVar15 = vsubps_avx(auVar82,auVar281);
  lVar12 = *(long *)(_Var9 + 0x38 + lVar73);
  lVar14 = *(long *)(_Var9 + 0x48 + lVar73);
  puVar3 = (undefined8 *)(lVar12 + lVar14 * uVar69);
  uVar5 = *puVar3;
  uVar56 = puVar3[1];
  fVar317 = fVar317 * 0.0;
  fVar328 = fVar328 * 0.0;
  fVar329 = fVar329 * 0.0;
  fVar330 = fVar330 * 0.0;
  auVar321._0_4_ = fVar350 + fVar317 + fVar239;
  auVar321._4_4_ = fVar360 + fVar328 + fVar240;
  auVar321._8_4_ = fVar361 + fVar329 + fVar241;
  auVar321._12_4_ = fVar362 + fVar330 + fVar152;
  fVar303 = fVar303 * 0.0;
  fVar314 = fVar314 * 0.0;
  fVar315 = fVar315 * 0.0;
  fVar316 = fVar316 * 0.0;
  auVar365._0_4_ = fVar303 + fVar363 + fVar153;
  auVar365._4_4_ = fVar314 + fVar368 + fVar76;
  auVar365._8_4_ = fVar315 + fVar370 + fVar154;
  auVar365._12_4_ = fVar316 + fVar373 + fVar155;
  auVar159._0_4_ = fVar239 * 0.0;
  auVar159._4_4_ = fVar240 * 0.0;
  auVar159._8_4_ = fVar241 * 0.0;
  auVar159._12_4_ = fVar152 * 0.0;
  auVar307._0_4_ = fVar331 + fVar267 + fVar317 + auVar159._0_4_;
  auVar307._4_4_ = fVar335 + fVar277 + fVar328 + auVar159._4_4_;
  auVar307._8_4_ = fVar336 + fVar192 + fVar329 + auVar159._8_4_;
  auVar307._12_4_ = fVar337 + fVar214 + fVar330 + auVar159._12_4_;
  auVar195._0_4_ = fVar267 * 3.0;
  auVar195._4_4_ = fVar277 * 3.0;
  auVar195._8_4_ = fVar192 * 3.0;
  auVar195._12_4_ = fVar214 * 3.0;
  auVar271._0_4_ = auVar187._0_4_ * 3.0;
  auVar271._4_4_ = auVar187._4_4_ * 3.0;
  auVar271._8_4_ = auVar187._8_4_ * 3.0;
  auVar271._12_4_ = auVar187._12_4_ * 3.0;
  auVar88 = vsubps_avx(auVar195,auVar271);
  auVar83._0_4_ = fVar317 + auVar88._0_4_;
  auVar83._4_4_ = fVar328 + auVar88._4_4_;
  auVar83._8_4_ = fVar329 + auVar88._8_4_;
  auVar83._12_4_ = fVar330 + auVar88._12_4_;
  auVar173 = vsubps_avx(auVar83,auVar159);
  auVar160._0_4_ = fVar153 * 0.0;
  auVar160._4_4_ = fVar76 * 0.0;
  auVar160._8_4_ = fVar154 * 0.0;
  auVar160._12_4_ = fVar155 * 0.0;
  auVar84._0_4_ = auVar160._0_4_ + fVar303 + fVar342 + fVar276;
  auVar84._4_4_ = auVar160._4_4_ + fVar314 + fVar346 + fVar278;
  auVar84._8_4_ = auVar160._8_4_ + fVar315 + fVar347 + fVar213;
  auVar84._12_4_ = auVar160._12_4_ + fVar316 + fVar348 + fVar215;
  auVar196._0_4_ = fVar276 * 3.0;
  auVar196._4_4_ = fVar278 * 3.0;
  auVar196._8_4_ = fVar213 * 3.0;
  auVar196._12_4_ = fVar215 * 3.0;
  auVar220._0_4_ = auVar282._0_4_ * 3.0;
  auVar220._4_4_ = auVar282._4_4_ * 3.0;
  auVar220._8_4_ = auVar282._8_4_ * 3.0;
  auVar220._12_4_ = auVar282._12_4_ * 3.0;
  auVar88 = vsubps_avx(auVar196,auVar220);
  auVar197._0_4_ = fVar303 + auVar88._0_4_;
  auVar197._4_4_ = fVar314 + auVar88._4_4_;
  auVar197._8_4_ = fVar315 + auVar88._8_4_;
  auVar197._12_4_ = fVar316 + auVar88._12_4_;
  auVar142 = vsubps_avx(auVar197,auVar160);
  auVar88 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar199 = vshufps_avx(auVar365,auVar365,0xc9);
  fVar239 = auVar130._0_4_;
  auVar221._0_4_ = fVar239 * auVar199._0_4_;
  fVar241 = auVar130._4_4_;
  auVar221._4_4_ = fVar241 * auVar199._4_4_;
  fVar76 = auVar130._8_4_;
  auVar221._8_4_ = fVar76 * auVar199._8_4_;
  fVar317 = auVar130._12_4_;
  auVar221._12_4_ = fVar317 * auVar199._12_4_;
  auVar244._0_4_ = auVar365._0_4_ * auVar88._0_4_;
  auVar244._4_4_ = auVar365._4_4_ * auVar88._4_4_;
  auVar244._8_4_ = auVar365._8_4_ * auVar88._8_4_;
  auVar244._12_4_ = auVar365._12_4_ * auVar88._12_4_;
  auVar199 = vsubps_avx(auVar244,auVar221);
  auVar187 = vshufps_avx(auVar199,auVar199,0xc9);
  auVar199 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar222._0_4_ = fVar239 * auVar199._0_4_;
  auVar222._4_4_ = fVar241 * auVar199._4_4_;
  auVar222._8_4_ = fVar76 * auVar199._8_4_;
  auVar222._12_4_ = fVar317 * auVar199._12_4_;
  auVar161._0_4_ = auVar15._0_4_ * auVar88._0_4_;
  auVar161._4_4_ = auVar15._4_4_ * auVar88._4_4_;
  auVar161._8_4_ = auVar15._8_4_ * auVar88._8_4_;
  auVar161._12_4_ = auVar15._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar161,auVar222);
  auVar282 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar199 = vshufps_avx(auVar173,auVar173,0xc9);
  auVar88 = vshufps_avx(auVar84,auVar84,0xc9);
  fVar350 = auVar173._0_4_;
  auVar162._0_4_ = fVar350 * auVar88._0_4_;
  fVar360 = auVar173._4_4_;
  auVar162._4_4_ = fVar360 * auVar88._4_4_;
  fVar361 = auVar173._8_4_;
  auVar162._8_4_ = fVar361 * auVar88._8_4_;
  fVar362 = auVar173._12_4_;
  auVar162._12_4_ = fVar362 * auVar88._12_4_;
  auVar85._0_4_ = auVar199._0_4_ * auVar84._0_4_;
  auVar85._4_4_ = auVar199._4_4_ * auVar84._4_4_;
  auVar85._8_4_ = auVar199._8_4_ * auVar84._8_4_;
  auVar85._12_4_ = auVar199._12_4_ * auVar84._12_4_;
  auVar88 = vsubps_avx(auVar85,auVar162);
  auVar15 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar168 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar88 = vdpps_avx(auVar187,auVar187,0x7f);
  auVar86._0_4_ = fVar350 * auVar168._0_4_;
  auVar86._4_4_ = fVar360 * auVar168._4_4_;
  auVar86._8_4_ = fVar361 * auVar168._8_4_;
  auVar86._12_4_ = fVar362 * auVar168._12_4_;
  auVar198._0_4_ = auVar199._0_4_ * auVar142._0_4_;
  auVar198._4_4_ = auVar199._4_4_ * auVar142._4_4_;
  auVar198._8_4_ = auVar199._8_4_ * auVar142._8_4_;
  auVar198._12_4_ = auVar199._12_4_ * auVar142._12_4_;
  auVar142 = vsubps_avx(auVar198,auVar86);
  fVar276 = auVar88._0_4_;
  auVar87 = ZEXT416((uint)fVar276);
  auVar199 = vrsqrtss_avx(auVar87,auVar87);
  fVar267 = auVar199._0_4_;
  auVar199 = ZEXT416((uint)(fVar267 * 1.5 - fVar276 * 0.5 * fVar267 * fVar267 * fVar267));
  auVar168 = vshufps_avx(auVar199,auVar199,0);
  auVar199 = vdpps_avx(auVar187,auVar282,0x7f);
  fVar192 = auVar168._0_4_ * auVar187._0_4_;
  fVar213 = auVar168._4_4_ * auVar187._4_4_;
  fVar214 = auVar168._8_4_ * auVar187._8_4_;
  fVar215 = auVar168._12_4_ * auVar187._12_4_;
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar256._0_4_ = auVar88._0_4_ * auVar282._0_4_;
  auVar256._4_4_ = auVar88._4_4_ * auVar282._4_4_;
  auVar256._8_4_ = auVar88._8_4_ * auVar282._8_4_;
  auVar256._12_4_ = auVar88._12_4_ * auVar282._12_4_;
  auVar88 = vshufps_avx(auVar199,auVar199,0);
  auVar245._0_4_ = auVar88._0_4_ * auVar187._0_4_;
  auVar245._4_4_ = auVar88._4_4_ * auVar187._4_4_;
  auVar245._8_4_ = auVar88._8_4_ * auVar187._8_4_;
  auVar245._12_4_ = auVar88._12_4_ * auVar187._12_4_;
  auVar131 = vsubps_avx(auVar256,auVar245);
  auVar88 = vrcpss_avx(auVar87,auVar87);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar276 * auVar88._0_4_)));
  auVar187 = vshufps_avx(auVar88,auVar88,0);
  auVar199 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar240 = auVar199._0_4_;
  auVar272 = ZEXT416((uint)fVar240);
  auVar88 = vrsqrtss_avx(auVar272,auVar272);
  fVar267 = auVar88._0_4_;
  auVar88 = *(undefined1 (*) [16])(lVar12 + lVar14 * lVar1);
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar73 + 0x38) +
                    *(long *)(p_Var11 + lVar73 + 0x48) * uVar69);
  auVar282 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar199 = vshufps_avx(auVar199,auVar199,0);
  auVar353._0_4_ = auVar199._0_4_ * auVar282._0_4_;
  auVar353._4_4_ = auVar199._4_4_ * auVar282._4_4_;
  auVar353._8_4_ = auVar199._8_4_ * auVar282._8_4_;
  auVar353._12_4_ = auVar199._12_4_ * auVar282._12_4_;
  auVar199 = vdpps_avx(auVar15,auVar282,0x7f);
  auVar282 = ZEXT416((uint)(fVar267 * 1.5 - fVar267 * fVar267 * fVar267 * fVar240 * 0.5));
  auVar282 = vshufps_avx(auVar282,auVar282,0);
  auVar199 = vshufps_avx(auVar199,auVar199,0);
  auVar223._0_4_ = auVar199._0_4_ * auVar15._0_4_;
  auVar223._4_4_ = auVar199._4_4_ * auVar15._4_4_;
  auVar223._8_4_ = auVar199._8_4_ * auVar15._8_4_;
  auVar223._12_4_ = auVar199._12_4_ * auVar15._12_4_;
  fVar267 = auVar282._0_4_ * auVar15._0_4_;
  fVar276 = auVar282._4_4_ * auVar15._4_4_;
  fVar277 = auVar282._8_4_ * auVar15._8_4_;
  fVar278 = auVar282._12_4_ * auVar15._12_4_;
  auVar87 = vsubps_avx(auVar353,auVar223);
  auVar199 = vrcpss_avx(auVar272,auVar272);
  auVar199 = ZEXT416((uint)(auVar199._0_4_ * (2.0 - fVar240 * auVar199._0_4_)));
  auVar199 = vshufps_avx(auVar199,auVar199,0);
  auVar15 = vshufps_avx(auVar321,auVar321,0xff);
  auVar354._0_4_ = auVar15._0_4_ * fVar192;
  auVar354._4_4_ = auVar15._4_4_ * fVar213;
  auVar354._8_4_ = auVar15._8_4_ * fVar214;
  auVar354._12_4_ = auVar15._12_4_ * fVar215;
  auVar272 = vsubps_avx(auVar321,auVar354);
  auVar142 = vshufps_avx(auVar130,auVar130,0xff);
  auVar200._0_4_ =
       auVar142._0_4_ * fVar192 + auVar15._0_4_ * auVar168._0_4_ * auVar187._0_4_ * auVar131._0_4_;
  auVar200._4_4_ =
       auVar142._4_4_ * fVar213 + auVar15._4_4_ * auVar168._4_4_ * auVar187._4_4_ * auVar131._4_4_;
  auVar200._8_4_ =
       auVar142._8_4_ * fVar214 + auVar15._8_4_ * auVar168._8_4_ * auVar187._8_4_ * auVar131._8_4_;
  auVar200._12_4_ =
       auVar142._12_4_ * fVar215 +
       auVar15._12_4_ * auVar168._12_4_ * auVar187._12_4_ * auVar131._12_4_;
  auVar142 = vsubps_avx(auVar130,auVar200);
  auVar187 = vshufps_avx(auVar307,auVar307,0xff);
  auVar246._0_4_ = auVar187._0_4_ * fVar267;
  auVar246._4_4_ = auVar187._4_4_ * fVar276;
  auVar246._8_4_ = auVar187._8_4_ * fVar277;
  auVar246._12_4_ = auVar187._12_4_ * fVar278;
  auVar130 = vsubps_avx(auVar307,auVar246);
  auVar15 = vshufps_avx(auVar173,auVar173,0xff);
  auVar120._0_4_ =
       auVar15._0_4_ * fVar267 + auVar187._0_4_ * auVar282._0_4_ * auVar87._0_4_ * auVar199._0_4_;
  auVar120._4_4_ =
       auVar15._4_4_ * fVar276 + auVar187._4_4_ * auVar282._4_4_ * auVar87._4_4_ * auVar199._4_4_;
  auVar120._8_4_ =
       auVar15._8_4_ * fVar277 + auVar187._8_4_ * auVar282._8_4_ * auVar87._8_4_ * auVar199._8_4_;
  auVar120._12_4_ =
       auVar15._12_4_ * fVar278 +
       auVar187._12_4_ * auVar282._12_4_ * auVar87._12_4_ * auVar199._12_4_;
  auVar173 = vsubps_avx(auVar173,auVar120);
  local_620._4_4_ = auVar307._4_4_ + auVar246._4_4_;
  local_620._0_4_ = auVar307._0_4_ + auVar246._0_4_;
  fStack_618 = auVar307._8_4_ + auVar246._8_4_;
  fStack_614 = auVar307._12_4_ + auVar246._12_4_;
  local_6b0._0_4_ = (undefined4)uVar5;
  local_6b0._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
  fStack_6a8 = (float)uVar56;
  fStack_6a4 = (float)((ulong)uVar56 >> 0x20);
  fVar342 = (float)local_6b0._0_4_ + *pfVar2 * 0.33333334;
  fVar346 = (float)local_6b0._4_4_ + pfVar2[1] * 0.33333334;
  fVar347 = fStack_6a8 + pfVar2[2] * 0.33333334;
  fVar348 = fStack_6a4 + pfVar2[3] * 0.33333334;
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar73 + 0x38) + *(long *)(p_Var11 + lVar73 + 0x48) * lVar1
                    );
  auVar89._0_4_ = *pfVar2 * 0.33333334;
  auVar89._4_4_ = pfVar2[1] * 0.33333334;
  auVar89._8_4_ = pfVar2[2] * 0.33333334;
  auVar89._12_4_ = pfVar2[3] * 0.33333334;
  auVar199 = vsubps_avx(auVar88,auVar89);
  fVar363 = auVar88._0_4_;
  fVar368 = auVar88._4_4_;
  fVar370 = auVar88._8_4_;
  fVar373 = auVar88._12_4_;
  fVar331 = auVar199._0_4_ * 0.0;
  fVar335 = auVar199._4_4_ * 0.0;
  fVar336 = auVar199._8_4_ * 0.0;
  fVar337 = auVar199._12_4_ * 0.0;
  fVar364 = fVar363 * 0.0 + fVar331;
  fVar369 = fVar368 * 0.0 + fVar335;
  fVar371 = fVar370 * 0.0 + fVar336;
  fVar374 = fVar373 * 0.0 + fVar337;
  auVar121._0_4_ = fVar364 + fVar342 * 3.0;
  auVar121._4_4_ = fVar369 + fVar346 * 3.0;
  auVar121._8_4_ = fVar371 + fVar347 * 3.0;
  auVar121._12_4_ = fVar374 + fVar348 * 3.0;
  auVar163._0_4_ = (float)local_6b0._0_4_ * 3.0;
  auVar163._4_4_ = (float)local_6b0._4_4_ * 3.0;
  auVar163._8_4_ = fStack_6a8 * 3.0;
  auVar163._12_4_ = fStack_6a4 * 3.0;
  auVar131 = vsubps_avx(auVar121,auVar163);
  lVar12 = *(long *)(lVar10 + 0x38 + lVar73);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar73);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar73);
  lVar73 = *(long *)(_Var13 + 0x48 + lVar73);
  pfVar2 = (float *)(lVar12 + lVar10 * uVar69);
  fVar267 = *pfVar2;
  fVar276 = pfVar2[1];
  fVar277 = pfVar2[2];
  fVar278 = pfVar2[3];
  pfVar2 = (float *)(lVar14 + uVar69 * lVar73);
  fVar303 = fVar267 + *pfVar2 * 0.33333334;
  fVar314 = fVar276 + pfVar2[1] * 0.33333334;
  fVar315 = fVar277 + pfVar2[2] * 0.33333334;
  fVar316 = fVar278 + pfVar2[3] * 0.33333334;
  auVar88 = *(undefined1 (*) [16])(lVar12 + lVar10 * lVar1);
  pfVar2 = (float *)(lVar14 + lVar73 * lVar1);
  auVar164._0_4_ = *pfVar2 * 0.33333334;
  auVar164._4_4_ = pfVar2[1] * 0.33333334;
  auVar164._8_4_ = pfVar2[2] * 0.33333334;
  auVar164._12_4_ = pfVar2[3] * 0.33333334;
  auVar187 = vsubps_avx(auVar88,auVar164);
  fVar192 = auVar88._0_4_;
  fVar213 = auVar88._4_4_;
  fVar214 = auVar88._8_4_;
  fVar215 = auVar88._12_4_;
  fVar240 = auVar187._0_4_ * 0.0;
  fVar152 = auVar187._4_4_ * 0.0;
  fVar153 = auVar187._8_4_ * 0.0;
  fVar154 = auVar187._12_4_ * 0.0;
  fVar155 = fVar192 * 0.0 + fVar240;
  fVar328 = fVar213 * 0.0 + fVar152;
  fVar329 = fVar214 * 0.0 + fVar153;
  fVar330 = fVar215 * 0.0 + fVar154;
  auVar257._0_4_ = fVar303 * 3.0 + fVar155;
  auVar257._4_4_ = fVar314 * 3.0 + fVar328;
  auVar257._8_4_ = fVar315 * 3.0 + fVar329;
  auVar257._12_4_ = fVar316 * 3.0 + fVar330;
  auVar283._0_4_ = fVar267 * 3.0;
  auVar283._4_4_ = fVar276 * 3.0;
  auVar283._8_4_ = fVar277 * 3.0;
  auVar283._12_4_ = fVar278 * 3.0;
  auVar282 = vsubps_avx(auVar257,auVar283);
  auVar284._0_4_ = fVar363 * 3.0;
  auVar284._4_4_ = fVar368 * 3.0;
  auVar284._8_4_ = fVar370 * 3.0;
  auVar284._12_4_ = fVar373 * 3.0;
  auVar332._0_4_ = auVar199._0_4_ * 3.0;
  auVar332._4_4_ = auVar199._4_4_ * 3.0;
  auVar332._8_4_ = auVar199._8_4_ * 3.0;
  auVar332._12_4_ = auVar199._12_4_ * 3.0;
  auVar88 = vsubps_avx(auVar284,auVar332);
  fVar342 = fVar342 * 0.0;
  fVar346 = fVar346 * 0.0;
  fVar347 = fVar347 * 0.0;
  fVar348 = fVar348 * 0.0;
  auVar285._0_4_ = fVar342 + auVar88._0_4_;
  auVar285._4_4_ = fVar346 + auVar88._4_4_;
  auVar285._8_4_ = fVar347 + auVar88._8_4_;
  auVar285._12_4_ = fVar348 + auVar88._12_4_;
  auVar333._0_4_ = (float)local_6b0._0_4_ + fVar342 + fVar364;
  auVar333._4_4_ = (float)local_6b0._4_4_ + fVar346 + fVar369;
  auVar333._8_4_ = fStack_6a8 + fVar347 + fVar371;
  auVar333._12_4_ = fStack_6a4 + fVar348 + fVar374;
  auVar294._0_4_ = (float)local_6b0._0_4_ * 0.0;
  auVar294._4_4_ = (float)local_6b0._4_4_ * 0.0;
  auVar294._8_4_ = fStack_6a8 * 0.0;
  auVar294._12_4_ = fStack_6a4 * 0.0;
  local_6b0._0_4_ = auVar294._0_4_ + fVar342 + fVar363 + fVar331;
  local_6b0._4_4_ = auVar294._4_4_ + fVar346 + fVar368 + fVar335;
  fStack_6a8 = auVar294._8_4_ + fVar347 + fVar370 + fVar336;
  fStack_6a4 = auVar294._12_4_ + fVar348 + fVar373 + fVar337;
  auVar87 = vsubps_avx(auVar285,auVar294);
  auVar90._0_4_ = fVar192 * 3.0;
  auVar90._4_4_ = fVar213 * 3.0;
  auVar90._8_4_ = fVar214 * 3.0;
  auVar90._12_4_ = fVar215 * 3.0;
  auVar201._0_4_ = auVar187._0_4_ * 3.0;
  auVar201._4_4_ = auVar187._4_4_ * 3.0;
  auVar201._8_4_ = auVar187._8_4_ * 3.0;
  auVar201._12_4_ = auVar187._12_4_ * 3.0;
  auVar88 = vsubps_avx(auVar90,auVar201);
  fVar303 = fVar303 * 0.0;
  fVar314 = fVar314 * 0.0;
  fVar315 = fVar315 * 0.0;
  fVar316 = fVar316 * 0.0;
  auVar91._0_4_ = fVar303 + auVar88._0_4_;
  auVar91._4_4_ = fVar314 + auVar88._4_4_;
  auVar91._8_4_ = fVar315 + auVar88._8_4_;
  auVar91._12_4_ = fVar316 + auVar88._12_4_;
  auVar165._0_4_ = fVar267 + fVar303 + fVar155;
  auVar165._4_4_ = fVar276 + fVar314 + fVar328;
  auVar165._8_4_ = fVar277 + fVar315 + fVar329;
  auVar165._12_4_ = fVar278 + fVar316 + fVar330;
  auVar202._0_4_ = fVar267 * 0.0;
  auVar202._4_4_ = fVar276 * 0.0;
  auVar202._8_4_ = fVar277 * 0.0;
  auVar202._12_4_ = fVar278 * 0.0;
  auVar122._0_4_ = auVar202._0_4_ + fVar303 + fVar192 + fVar240;
  auVar122._4_4_ = auVar202._4_4_ + fVar314 + fVar213 + fVar152;
  auVar122._8_4_ = auVar202._8_4_ + fVar315 + fVar214 + fVar153;
  auVar122._12_4_ = auVar202._12_4_ + fVar316 + fVar215 + fVar154;
  auVar199 = vsubps_avx(auVar91,auVar202);
  auVar88 = vshufps_avx(auVar165,auVar165,0xc9);
  fVar330 = auVar131._0_4_;
  auVar203._0_4_ = fVar330 * auVar88._0_4_;
  fVar314 = auVar131._4_4_;
  auVar203._4_4_ = fVar314 * auVar88._4_4_;
  fVar315 = auVar131._8_4_;
  auVar203._8_4_ = fVar315 * auVar88._8_4_;
  fVar316 = auVar131._12_4_;
  auVar203._12_4_ = fVar316 * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar166._0_4_ = auVar88._0_4_ * auVar165._0_4_;
  auVar166._4_4_ = auVar88._4_4_ * auVar165._4_4_;
  auVar166._8_4_ = auVar88._8_4_ * auVar165._8_4_;
  auVar166._12_4_ = auVar88._12_4_ * auVar165._12_4_;
  auVar187 = vsubps_avx(auVar166,auVar203);
  auVar204._0_4_ = auVar88._0_4_ * auVar282._0_4_;
  auVar204._4_4_ = auVar88._4_4_ * auVar282._4_4_;
  auVar204._8_4_ = auVar88._8_4_ * auVar282._8_4_;
  auVar204._12_4_ = auVar88._12_4_ * auVar282._12_4_;
  auVar88 = vshufps_avx(auVar282,auVar282,0xc9);
  auVar224._0_4_ = fVar330 * auVar88._0_4_;
  auVar224._4_4_ = fVar314 * auVar88._4_4_;
  auVar224._8_4_ = fVar315 * auVar88._8_4_;
  auVar224._12_4_ = fVar316 * auVar88._12_4_;
  auVar282 = vsubps_avx(auVar204,auVar224);
  auVar88 = vshufps_avx(auVar122,auVar122,0xc9);
  fVar240 = auVar87._0_4_;
  auVar225._0_4_ = fVar240 * auVar88._0_4_;
  fVar153 = auVar87._4_4_;
  auVar225._4_4_ = fVar153 * auVar88._4_4_;
  fVar155 = auVar87._8_4_;
  auVar225._8_4_ = fVar155 * auVar88._8_4_;
  fVar329 = auVar87._12_4_;
  auVar225._12_4_ = fVar329 * auVar88._12_4_;
  auVar88 = vshufps_avx(auVar87,auVar87,0xc9);
  auVar123._0_4_ = auVar88._0_4_ * auVar122._0_4_;
  auVar123._4_4_ = auVar88._4_4_ * auVar122._4_4_;
  auVar123._8_4_ = auVar88._8_4_ * auVar122._8_4_;
  auVar123._12_4_ = auVar88._12_4_ * auVar122._12_4_;
  auVar15 = vsubps_avx(auVar123,auVar225);
  auVar187 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar167._0_4_ = auVar88._0_4_ * auVar199._0_4_;
  auVar167._4_4_ = auVar88._4_4_ * auVar199._4_4_;
  auVar167._8_4_ = auVar88._8_4_ * auVar199._8_4_;
  auVar167._12_4_ = auVar88._12_4_ * auVar199._12_4_;
  auVar88 = vdpps_avx(auVar187,auVar187,0x7f);
  auVar199 = vshufps_avx(auVar199,auVar199,0xc9);
  auVar92._0_4_ = fVar240 * auVar199._0_4_;
  auVar92._4_4_ = fVar153 * auVar199._4_4_;
  auVar92._8_4_ = fVar155 * auVar199._8_4_;
  auVar92._12_4_ = fVar329 * auVar199._12_4_;
  auVar78 = vsubps_avx(auVar167,auVar92);
  fVar267 = auVar88._0_4_;
  auVar168 = ZEXT416((uint)fVar267);
  auVar199 = vrsqrtss_avx(auVar168,auVar168);
  fVar276 = auVar199._0_4_;
  auVar282 = vshufps_avx(auVar282,auVar282,0xc9);
  auVar199 = vdpps_avx(auVar187,auVar282,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar205._0_4_ = auVar88._0_4_ * auVar282._0_4_;
  auVar205._4_4_ = auVar88._4_4_ * auVar282._4_4_;
  auVar205._8_4_ = auVar88._8_4_ * auVar282._8_4_;
  auVar205._12_4_ = auVar88._12_4_ * auVar282._12_4_;
  auVar88 = vshufps_avx(auVar199,auVar199,0);
  auVar258._0_4_ = auVar187._0_4_ * auVar88._0_4_;
  auVar258._4_4_ = auVar187._4_4_ * auVar88._4_4_;
  auVar258._8_4_ = auVar187._8_4_ * auVar88._8_4_;
  auVar258._12_4_ = auVar187._12_4_ * auVar88._12_4_;
  auVar79 = vsubps_avx(auVar205,auVar258);
  auVar88 = vrcpss_avx(auVar168,auVar168);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar267 * auVar88._0_4_)));
  auVar282 = vshufps_avx(auVar88,auVar88,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar88 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar199 = ZEXT416((uint)(fVar276 * 1.5 - fVar276 * fVar276 * fVar267 * 0.5 * fVar276));
  auVar168 = vshufps_avx(auVar199,auVar199,0);
  fVar267 = auVar187._0_4_ * auVar168._0_4_;
  fVar276 = auVar187._4_4_ * auVar168._4_4_;
  fVar277 = auVar187._8_4_ * auVar168._8_4_;
  fVar278 = auVar187._12_4_ * auVar168._12_4_;
  fVar192 = auVar88._0_4_;
  auVar118 = ZEXT416((uint)fVar192);
  auVar199 = vrsqrtss_avx(auVar118,auVar118);
  fVar213 = auVar199._0_4_;
  auVar187 = vshufps_avx(auVar78,auVar78,0xc9);
  auVar199 = vdpps_avx(auVar15,auVar187,0x7f);
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar93._0_4_ = auVar88._0_4_ * auVar187._0_4_;
  auVar93._4_4_ = auVar88._4_4_ * auVar187._4_4_;
  auVar93._8_4_ = auVar88._8_4_ * auVar187._8_4_;
  auVar93._12_4_ = auVar88._12_4_ * auVar187._12_4_;
  auVar88 = vshufps_avx(auVar199,auVar199,0);
  auVar259._0_4_ = auVar88._0_4_ * auVar15._0_4_;
  auVar259._4_4_ = auVar88._4_4_ * auVar15._4_4_;
  auVar259._8_4_ = auVar88._8_4_ * auVar15._8_4_;
  auVar259._12_4_ = auVar88._12_4_ * auVar15._12_4_;
  auVar78 = vsubps_avx(auVar93,auVar259);
  auVar88 = vrcpss_avx(auVar118,auVar118);
  auVar88 = ZEXT416((uint)(auVar88._0_4_ * (2.0 - fVar192 * auVar88._0_4_)));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar199 = ZEXT416((uint)(fVar213 * 1.5 - fVar213 * fVar213 * fVar192 * 0.5 * fVar213));
  auVar199 = vshufps_avx(auVar199,auVar199,0);
  fVar192 = auVar15._0_4_ * auVar199._0_4_;
  fVar213 = auVar15._4_4_ * auVar199._4_4_;
  fVar214 = auVar15._8_4_ * auVar199._8_4_;
  fVar215 = auVar15._12_4_ * auVar199._12_4_;
  auVar187 = vshufps_avx(auVar131,auVar131,0xff);
  auVar15 = vshufps_avx(auVar333,auVar333,0xff);
  auVar124._0_4_ = auVar15._0_4_ * fVar267;
  auVar124._4_4_ = auVar15._4_4_ * fVar276;
  auVar124._8_4_ = auVar15._8_4_ * fVar277;
  auVar124._12_4_ = auVar15._12_4_ * fVar278;
  auVar169._0_4_ =
       auVar187._0_4_ * fVar267 + auVar168._0_4_ * auVar282._0_4_ * auVar79._0_4_ * auVar15._0_4_;
  auVar169._4_4_ =
       auVar187._4_4_ * fVar276 + auVar168._4_4_ * auVar282._4_4_ * auVar79._4_4_ * auVar15._4_4_;
  auVar169._8_4_ =
       auVar187._8_4_ * fVar277 + auVar168._8_4_ * auVar282._8_4_ * auVar79._8_4_ * auVar15._8_4_;
  auVar169._12_4_ =
       auVar187._12_4_ * fVar278 +
       auVar168._12_4_ * auVar282._12_4_ * auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar333,auVar124);
  auVar168 = vsubps_avx(auVar131,auVar169);
  auVar187 = vshufps_avx(auVar87,auVar87,0xff);
  auVar282 = vshufps_avx(_local_6b0,_local_6b0,0xff);
  auVar206._0_4_ = auVar282._0_4_ * fVar192;
  auVar206._4_4_ = auVar282._4_4_ * fVar213;
  auVar206._8_4_ = auVar282._8_4_ * fVar214;
  auVar206._12_4_ = auVar282._12_4_ * fVar215;
  auVar125._0_4_ =
       auVar187._0_4_ * fVar192 + auVar282._0_4_ * auVar199._0_4_ * auVar78._0_4_ * auVar88._0_4_;
  auVar125._4_4_ =
       auVar187._4_4_ * fVar213 + auVar282._4_4_ * auVar199._4_4_ * auVar78._4_4_ * auVar88._4_4_;
  auVar125._8_4_ =
       auVar187._8_4_ * fVar214 + auVar282._8_4_ * auVar199._8_4_ * auVar78._8_4_ * auVar88._8_4_;
  auVar125._12_4_ =
       auVar187._12_4_ * fVar215 +
       auVar282._12_4_ * auVar199._12_4_ * auVar78._12_4_ * auVar88._12_4_;
  auVar187 = vsubps_avx(_local_6b0,auVar206);
  auVar343._0_4_ = (float)local_6b0._0_4_ + auVar206._0_4_;
  auVar343._4_4_ = (float)local_6b0._4_4_ + auVar206._4_4_;
  auVar343._8_4_ = fStack_6a8 + auVar206._8_4_;
  auVar343._12_4_ = fStack_6a4 + auVar206._12_4_;
  auVar282 = vsubps_avx(auVar87,auVar125);
  local_600 = auVar142._0_4_;
  fStack_5fc = auVar142._4_4_;
  fStack_5f8 = auVar142._8_4_;
  fStack_5f4 = auVar142._12_4_;
  local_5e0 = auVar272._0_4_;
  fStack_5dc = auVar272._4_4_;
  fStack_5d8 = auVar272._8_4_;
  fStack_5d4 = auVar272._12_4_;
  auVar88 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
  auVar199 = vshufps_avx(ZEXT416((uint)(1.0 - fVar216)),ZEXT416((uint)(1.0 - fVar216)),0);
  fVar267 = auVar88._0_4_;
  fVar276 = auVar88._4_4_;
  fVar277 = auVar88._8_4_;
  fVar278 = auVar88._12_4_;
  fVar192 = auVar199._0_4_;
  fVar213 = auVar199._4_4_;
  fVar214 = auVar199._8_4_;
  fVar215 = auVar199._12_4_;
  local_4c0._0_4_ = fVar192 * local_5e0 + fVar267 * auVar15._0_4_;
  local_4c0._4_4_ = fVar213 * fStack_5dc + fVar276 * auVar15._4_4_;
  fStack_4b8 = fVar214 * fStack_5d8 + fVar277 * auVar15._8_4_;
  fStack_4b4 = fVar215 * fStack_5d4 + fVar278 * auVar15._12_4_;
  fVar152 = fVar192 * (local_5e0 + local_600 * 0.33333334) +
            fVar267 * (auVar15._0_4_ + auVar168._0_4_ * 0.33333334);
  fVar154 = fVar213 * (fStack_5dc + fStack_5fc * 0.33333334) +
            fVar276 * (auVar15._4_4_ + auVar168._4_4_ * 0.33333334);
  fVar328 = fVar214 * (fStack_5d8 + fStack_5f8 * 0.33333334) +
            fVar277 * (auVar15._8_4_ + auVar168._8_4_ * 0.33333334);
  fVar303 = fVar215 * (fStack_5d4 + fStack_5f4 * 0.33333334) +
            fVar278 * (auVar15._12_4_ + auVar168._12_4_ * 0.33333334);
  local_680 = auVar173._0_4_;
  fStack_67c = auVar173._4_4_;
  fStack_678 = auVar173._8_4_;
  fStack_674 = auVar173._12_4_;
  auVar226._0_4_ = local_680 * 0.33333334;
  auVar226._4_4_ = fStack_67c * 0.33333334;
  auVar226._8_4_ = fStack_678 * 0.33333334;
  auVar226._12_4_ = fStack_674 * 0.33333334;
  auVar88 = vsubps_avx(auVar130,auVar226);
  auVar260._0_4_ = (fVar350 + auVar120._0_4_) * 0.33333334;
  auVar260._4_4_ = (fVar360 + auVar120._4_4_) * 0.33333334;
  auVar260._8_4_ = (fVar361 + auVar120._8_4_) * 0.33333334;
  auVar260._12_4_ = (fVar362 + auVar120._12_4_) * 0.33333334;
  auVar199 = vsubps_avx(_local_620,auVar260);
  auVar207._0_4_ = auVar282._0_4_ * 0.33333334;
  auVar207._4_4_ = auVar282._4_4_ * 0.33333334;
  auVar207._8_4_ = auVar282._8_4_ * 0.33333334;
  auVar207._12_4_ = auVar282._12_4_ * 0.33333334;
  auVar282 = vsubps_avx(auVar187,auVar207);
  auVar126._0_4_ = (fVar240 + auVar125._0_4_) * 0.33333334;
  auVar126._4_4_ = (fVar153 + auVar125._4_4_) * 0.33333334;
  auVar126._8_4_ = (fVar155 + auVar125._8_4_) * 0.33333334;
  auVar126._12_4_ = (fVar329 + auVar125._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar343,auVar126);
  local_4d0._0_4_ = fVar192 * auVar88._0_4_ + fVar267 * auVar282._0_4_;
  local_4d0._4_4_ = fVar213 * auVar88._4_4_ + fVar276 * auVar282._4_4_;
  fStack_4c8 = fVar214 * auVar88._8_4_ + fVar277 * auVar282._8_4_;
  fStack_4c4 = fVar215 * auVar88._12_4_ + fVar278 * auVar282._12_4_;
  local_4e0._0_4_ = auVar187._0_4_ * fVar267 + fVar192 * auVar130._0_4_;
  local_4e0._4_4_ = auVar187._4_4_ * fVar276 + fVar213 * auVar130._4_4_;
  fStack_4d8 = auVar187._8_4_ * fVar277 + fVar214 * auVar130._8_4_;
  fStack_4d4 = auVar187._12_4_ * fVar278 + fVar215 * auVar130._12_4_;
  local_4f0._0_4_ =
       fVar192 * (auVar321._0_4_ + auVar354._0_4_) + fVar267 * (auVar333._0_4_ + auVar124._0_4_);
  local_4f0._4_4_ =
       fVar213 * (auVar321._4_4_ + auVar354._4_4_) + fVar276 * (auVar333._4_4_ + auVar124._4_4_);
  fStack_4e8 = fVar214 * (auVar321._8_4_ + auVar354._8_4_) +
               fVar277 * (auVar333._8_4_ + auVar124._8_4_);
  fStack_4e4 = fVar215 * (auVar321._12_4_ + auVar354._12_4_) +
               fVar278 * (auVar333._12_4_ + auVar124._12_4_);
  fVar153 = fVar192 * (auVar321._0_4_ + auVar354._0_4_ + (fVar239 + auVar200._0_4_) * 0.33333334) +
            ((fVar330 + auVar169._0_4_) * 0.33333334 + auVar333._0_4_ + auVar124._0_4_) * fVar267;
  fVar155 = fVar213 * (auVar321._4_4_ + auVar354._4_4_ + (fVar241 + auVar200._4_4_) * 0.33333334) +
            ((fVar314 + auVar169._4_4_) * 0.33333334 + auVar333._4_4_ + auVar124._4_4_) * fVar276;
  fVar329 = fVar214 * (auVar321._8_4_ + auVar354._8_4_ + (fVar76 + auVar200._8_4_) * 0.33333334) +
            ((fVar315 + auVar169._8_4_) * 0.33333334 + auVar333._8_4_ + auVar124._8_4_) * fVar277;
  fVar314 = fVar215 * (auVar321._12_4_ + auVar354._12_4_ + (fVar317 + auVar200._12_4_) * 0.33333334)
            + ((fVar316 + auVar169._12_4_) * 0.33333334 + auVar333._12_4_ + auVar124._12_4_) *
              fVar278;
  fVar76 = fVar192 * auVar199._0_4_ + fVar267 * auVar15._0_4_;
  fVar317 = fVar213 * auVar199._4_4_ + fVar276 * auVar15._4_4_;
  fVar330 = fVar214 * auVar199._8_4_ + fVar277 * auVar15._8_4_;
  fVar315 = fVar215 * auVar199._12_4_ + fVar278 * auVar15._12_4_;
  local_500 = fVar192 * (auVar307._0_4_ + auVar246._0_4_) + auVar343._0_4_ * fVar267;
  fStack_4fc = fVar213 * (auVar307._4_4_ + auVar246._4_4_) + auVar343._4_4_ * fVar276;
  fStack_4f8 = fVar214 * (auVar307._8_4_ + auVar246._8_4_) + auVar343._8_4_ * fVar277;
  fStack_4f4 = fVar215 * (auVar307._12_4_ + auVar246._12_4_) + auVar343._12_4_ * fVar278;
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3a0 = vsubps_avx(_local_4c0,auVar88);
  auVar187 = vmovsldup_avx(local_3a0);
  auVar199 = vmovshdup_avx(local_3a0);
  auVar282 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar267 = pre->ray_space[k].vx.field_0.m128[0];
  fVar276 = pre->ray_space[k].vx.field_0.m128[1];
  fVar277 = pre->ray_space[k].vx.field_0.m128[2];
  fVar278 = pre->ray_space[k].vx.field_0.m128[3];
  fVar192 = pre->ray_space[k].vy.field_0.m128[0];
  fVar213 = pre->ray_space[k].vy.field_0.m128[1];
  fVar214 = pre->ray_space[k].vy.field_0.m128[2];
  fVar215 = pre->ray_space[k].vy.field_0.m128[3];
  fVar216 = pre->ray_space[k].vz.field_0.m128[0];
  fVar239 = pre->ray_space[k].vz.field_0.m128[1];
  fVar240 = pre->ray_space[k].vz.field_0.m128[2];
  fVar241 = pre->ray_space[k].vz.field_0.m128[3];
  local_710._0_4_ = fVar267 * auVar187._0_4_ + fVar192 * auVar199._0_4_ + fVar216 * auVar282._0_4_;
  local_710._4_4_ = fVar276 * auVar187._4_4_ + fVar213 * auVar199._4_4_ + fVar239 * auVar282._4_4_;
  fStack_708 = fVar277 * auVar187._8_4_ + fVar214 * auVar199._8_4_ + fVar240 * auVar282._8_4_;
  fStack_704 = fVar278 * auVar187._12_4_ + fVar215 * auVar199._12_4_ + fVar241 * auVar282._12_4_;
  auVar61._4_4_ = fVar154;
  auVar61._0_4_ = fVar152;
  auVar61._8_4_ = fVar328;
  auVar61._12_4_ = fVar303;
  local_3b0 = vsubps_avx(auVar61,auVar88);
  auVar282 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar199 = vmovshdup_avx(local_3b0);
  auVar187 = vmovsldup_avx(local_3b0);
  auVar344._0_4_ = fVar267 * auVar187._0_4_ + fVar192 * auVar199._0_4_ + fVar216 * auVar282._0_4_;
  auVar344._4_4_ = fVar276 * auVar187._4_4_ + fVar213 * auVar199._4_4_ + fVar239 * auVar282._4_4_;
  auVar344._8_4_ = fVar277 * auVar187._8_4_ + fVar214 * auVar199._8_4_ + fVar240 * auVar282._8_4_;
  auVar344._12_4_ =
       fVar278 * auVar187._12_4_ + fVar215 * auVar199._12_4_ + fVar241 * auVar282._12_4_;
  local_3c0 = vsubps_avx(_local_4d0,auVar88);
  auVar282 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar199 = vmovshdup_avx(local_3c0);
  auVar187 = vmovsldup_avx(local_3c0);
  auVar355._0_4_ = fVar267 * auVar187._0_4_ + fVar192 * auVar199._0_4_ + fVar216 * auVar282._0_4_;
  auVar355._4_4_ = fVar276 * auVar187._4_4_ + fVar213 * auVar199._4_4_ + fVar239 * auVar282._4_4_;
  auVar355._8_4_ = fVar277 * auVar187._8_4_ + fVar214 * auVar199._8_4_ + fVar240 * auVar282._8_4_;
  auVar355._12_4_ =
       fVar278 * auVar187._12_4_ + fVar215 * auVar199._12_4_ + fVar241 * auVar282._12_4_;
  local_3d0 = vsubps_avx(_local_4e0,auVar88);
  auVar282 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar199 = vmovshdup_avx(local_3d0);
  auVar187 = vmovsldup_avx(local_3d0);
  auVar127._0_4_ = auVar187._0_4_ * fVar267 + auVar199._0_4_ * fVar192 + fVar216 * auVar282._0_4_;
  auVar127._4_4_ = auVar187._4_4_ * fVar276 + auVar199._4_4_ * fVar213 + fVar239 * auVar282._4_4_;
  auVar127._8_4_ = auVar187._8_4_ * fVar277 + auVar199._8_4_ * fVar214 + fVar240 * auVar282._8_4_;
  auVar127._12_4_ =
       auVar187._12_4_ * fVar278 + auVar199._12_4_ * fVar215 + fVar241 * auVar282._12_4_;
  local_3e0 = vsubps_avx(_local_4f0,auVar88);
  auVar282 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar199 = vmovshdup_avx(local_3e0);
  auVar187 = vmovsldup_avx(local_3e0);
  auVar286._0_4_ = auVar187._0_4_ * fVar267 + auVar199._0_4_ * fVar192 + auVar282._0_4_ * fVar216;
  auVar286._4_4_ = auVar187._4_4_ * fVar276 + auVar199._4_4_ * fVar213 + auVar282._4_4_ * fVar239;
  auVar286._8_4_ = auVar187._8_4_ * fVar277 + auVar199._8_4_ * fVar214 + auVar282._8_4_ * fVar240;
  auVar286._12_4_ =
       auVar187._12_4_ * fVar278 + auVar199._12_4_ * fVar215 + auVar282._12_4_ * fVar241;
  auVar59._4_4_ = fVar155;
  auVar59._0_4_ = fVar153;
  auVar59._8_4_ = fVar329;
  auVar59._12_4_ = fVar314;
  local_3f0 = vsubps_avx(auVar59,auVar88);
  auVar282 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar199 = vmovshdup_avx(local_3f0);
  auVar187 = vmovsldup_avx(local_3f0);
  auVar295._0_4_ = auVar187._0_4_ * fVar267 + auVar199._0_4_ * fVar192 + auVar282._0_4_ * fVar216;
  auVar295._4_4_ = auVar187._4_4_ * fVar276 + auVar199._4_4_ * fVar213 + auVar282._4_4_ * fVar239;
  auVar295._8_4_ = auVar187._8_4_ * fVar277 + auVar199._8_4_ * fVar214 + auVar282._8_4_ * fVar240;
  auVar295._12_4_ =
       auVar187._12_4_ * fVar278 + auVar199._12_4_ * fVar215 + auVar282._12_4_ * fVar241;
  auVar57._4_4_ = fVar317;
  auVar57._0_4_ = fVar76;
  auVar57._8_4_ = fVar330;
  auVar57._12_4_ = fVar315;
  local_400 = vsubps_avx(auVar57,auVar88);
  auVar282 = vshufps_avx(local_400,local_400,0xaa);
  auVar199 = vmovshdup_avx(local_400);
  auVar187 = vmovsldup_avx(local_400);
  auVar308._0_4_ = auVar187._0_4_ * fVar267 + auVar199._0_4_ * fVar192 + auVar282._0_4_ * fVar216;
  auVar308._4_4_ = auVar187._4_4_ * fVar276 + auVar199._4_4_ * fVar213 + auVar282._4_4_ * fVar239;
  auVar308._8_4_ = auVar187._8_4_ * fVar277 + auVar199._8_4_ * fVar214 + auVar282._8_4_ * fVar240;
  auVar308._12_4_ =
       auVar187._12_4_ * fVar278 + auVar199._12_4_ * fVar215 + auVar282._12_4_ * fVar241;
  auVar63._4_4_ = fStack_4fc;
  auVar63._0_4_ = local_500;
  auVar63._8_4_ = fStack_4f8;
  auVar63._12_4_ = fStack_4f4;
  local_410 = vsubps_avx(auVar63,auVar88);
  auVar187 = vshufps_avx(local_410,local_410,0xaa);
  auVar88 = vmovshdup_avx(local_410);
  auVar199 = vmovsldup_avx(local_410);
  auVar94._0_4_ = fVar267 * auVar199._0_4_ + fVar192 * auVar88._0_4_ + fVar216 * auVar187._0_4_;
  auVar94._4_4_ = fVar276 * auVar199._4_4_ + fVar213 * auVar88._4_4_ + fVar239 * auVar187._4_4_;
  auVar94._8_4_ = fVar277 * auVar199._8_4_ + fVar214 * auVar88._8_4_ + fVar240 * auVar187._8_4_;
  auVar94._12_4_ = fVar278 * auVar199._12_4_ + fVar215 * auVar88._12_4_ + fVar241 * auVar187._12_4_;
  auVar282 = vmovlhps_avx(_local_710,auVar286);
  auVar15 = vmovlhps_avx(auVar344,auVar295);
  auVar168 = vmovlhps_avx(auVar355,auVar308);
  _local_380 = vmovlhps_avx(auVar127,auVar94);
  auVar88 = vminps_avx(auVar282,auVar15);
  auVar199 = vminps_avx(auVar168,_local_380);
  auVar187 = vminps_avx(auVar88,auVar199);
  auVar88 = vmaxps_avx(auVar282,auVar15);
  auVar199 = vmaxps_avx(auVar168,_local_380);
  auVar88 = vmaxps_avx(auVar88,auVar199);
  auVar199 = vshufpd_avx(auVar187,auVar187,3);
  auVar187 = vminps_avx(auVar187,auVar199);
  auVar199 = vshufpd_avx(auVar88,auVar88,3);
  auVar199 = vmaxps_avx(auVar88,auVar199);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar187,auVar261);
  auVar199 = vandps_avx(auVar199,auVar261);
  auVar88 = vmaxps_avx(auVar88,auVar199);
  auVar199 = vmovshdup_avx(auVar88);
  auVar88 = vmaxss_avx(auVar199,auVar88);
  fVar267 = auVar88._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar267);
  auVar88 = vshufps_avx(ZEXT416((uint)fVar267),ZEXT416((uint)fVar267),0);
  local_1c0._16_16_ = auVar88;
  local_1c0._0_16_ = auVar88;
  auVar95._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
  auVar95._8_4_ = auVar88._8_4_ ^ 0x80000000;
  auVar95._12_4_ = auVar88._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar95;
  local_1e0._0_16_ = auVar95;
  auVar88 = vpshufd_avx(ZEXT416(uVar65),0);
  local_300._16_16_ = auVar88;
  local_300._0_16_ = auVar88;
  auVar88 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar68 * 4 + 6)),0);
  local_320._16_16_ = auVar88;
  local_320._0_16_ = auVar88;
  bVar75 = false;
  uVar69 = 0;
  fVar267 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar15,auVar282);
  _local_360 = vsubps_avx(auVar168,auVar15);
  _local_370 = vsubps_avx(_local_380,auVar168);
  _local_440 = vsubps_avx(_local_4f0,_local_4c0);
  auVar60._4_4_ = fVar155;
  auVar60._0_4_ = fVar153;
  auVar60._8_4_ = fVar329;
  auVar60._12_4_ = fVar314;
  auVar62._4_4_ = fVar154;
  auVar62._0_4_ = fVar152;
  auVar62._8_4_ = fVar328;
  auVar62._12_4_ = fVar303;
  _local_450 = vsubps_avx(auVar60,auVar62);
  auVar58._4_4_ = fVar317;
  auVar58._0_4_ = fVar76;
  auVar58._8_4_ = fVar330;
  auVar58._12_4_ = fVar315;
  _local_460 = vsubps_avx(auVar58,_local_4d0);
  _local_470 = vsubps_avx(auVar63,_local_4e0);
  auVar327 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar367 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0091f832:
  local_420 = auVar367._0_16_;
  auVar79 = auVar327._0_16_;
  auVar88 = vshufps_avx(auVar79,auVar79,0x50);
  auVar356._8_4_ = 0x3f800000;
  auVar356._0_8_ = 0x3f8000003f800000;
  auVar356._12_4_ = 0x3f800000;
  auVar359._16_4_ = 0x3f800000;
  auVar359._0_16_ = auVar356;
  auVar359._20_4_ = 0x3f800000;
  auVar359._24_4_ = 0x3f800000;
  auVar359._28_4_ = 0x3f800000;
  auVar199 = vsubps_avx(auVar356,auVar88);
  fVar276 = auVar88._0_4_;
  fVar277 = auVar88._4_4_;
  fVar278 = auVar88._8_4_;
  fVar192 = auVar88._12_4_;
  fVar213 = auVar199._0_4_;
  fVar214 = auVar199._4_4_;
  fVar215 = auVar199._8_4_;
  fVar216 = auVar199._12_4_;
  auVar208._0_4_ = auVar286._0_4_ * fVar276 + fVar213 * (float)local_710._0_4_;
  auVar208._4_4_ = auVar286._4_4_ * fVar277 + fVar214 * (float)local_710._4_4_;
  auVar208._8_4_ = auVar286._0_4_ * fVar278 + fVar215 * (float)local_710._0_4_;
  auVar208._12_4_ = auVar286._4_4_ * fVar192 + fVar216 * (float)local_710._4_4_;
  auVar170._0_4_ = auVar295._0_4_ * fVar276 + auVar344._0_4_ * fVar213;
  auVar170._4_4_ = auVar295._4_4_ * fVar277 + auVar344._4_4_ * fVar214;
  auVar170._8_4_ = auVar295._0_4_ * fVar278 + auVar344._0_4_ * fVar215;
  auVar170._12_4_ = auVar295._4_4_ * fVar192 + auVar344._4_4_ * fVar216;
  auVar273._0_4_ = auVar308._0_4_ * fVar276 + auVar355._0_4_ * fVar213;
  auVar273._4_4_ = auVar308._4_4_ * fVar277 + auVar355._4_4_ * fVar214;
  auVar273._8_4_ = auVar308._0_4_ * fVar278 + auVar355._0_4_ * fVar215;
  auVar273._12_4_ = auVar308._4_4_ * fVar192 + auVar355._4_4_ * fVar216;
  auVar227._0_4_ = auVar94._0_4_ * fVar276 + auVar127._0_4_ * fVar213;
  auVar227._4_4_ = auVar94._4_4_ * fVar277 + auVar127._4_4_ * fVar214;
  auVar227._8_4_ = auVar94._0_4_ * fVar278 + auVar127._0_4_ * fVar215;
  auVar227._12_4_ = auVar94._4_4_ * fVar192 + auVar127._4_4_ * fVar216;
  auVar88 = vmovshdup_avx(local_420);
  auVar199 = vshufps_avx(local_420,local_420,0);
  auVar298._16_16_ = auVar199;
  auVar298._0_16_ = auVar199;
  auVar187 = vshufps_avx(local_420,local_420,0x55);
  auVar111._16_16_ = auVar187;
  auVar111._0_16_ = auVar187;
  auVar110 = vsubps_avx(auVar111,auVar298);
  auVar187 = vshufps_avx(auVar208,auVar208,0);
  auVar142 = vshufps_avx(auVar208,auVar208,0x55);
  auVar130 = vshufps_avx(auVar170,auVar170,0);
  auVar173 = vshufps_avx(auVar170,auVar170,0x55);
  auVar131 = vshufps_avx(auVar273,auVar273,0);
  auVar87 = vshufps_avx(auVar273,auVar273,0x55);
  auVar272 = vshufps_avx(auVar227,auVar227,0);
  auVar78 = vshufps_avx(auVar227,auVar227,0x55);
  auVar88 = ZEXT416((uint)((auVar88._0_4_ - auVar367._0_4_) * 0.04761905));
  auVar88 = vshufps_avx(auVar88,auVar88,0);
  auVar313._0_4_ = auVar199._0_4_ + auVar110._0_4_ * 0.0;
  auVar313._4_4_ = auVar199._4_4_ + auVar110._4_4_ * 0.14285715;
  auVar313._8_4_ = auVar199._8_4_ + auVar110._8_4_ * 0.2857143;
  auVar313._12_4_ = auVar199._12_4_ + auVar110._12_4_ * 0.42857146;
  auVar313._16_4_ = auVar199._0_4_ + auVar110._16_4_ * 0.5714286;
  auVar313._20_4_ = auVar199._4_4_ + auVar110._20_4_ * 0.71428573;
  auVar313._24_4_ = auVar199._8_4_ + auVar110._24_4_ * 0.8571429;
  auVar313._28_4_ = auVar199._12_4_ + auVar110._28_4_;
  auVar16 = vsubps_avx(auVar359,auVar313);
  fVar276 = auVar130._0_4_;
  fVar278 = auVar130._4_4_;
  fVar213 = auVar130._8_4_;
  fVar215 = auVar130._12_4_;
  fVar364 = auVar16._0_4_;
  fVar369 = auVar16._4_4_;
  fVar371 = auVar16._8_4_;
  fVar374 = auVar16._12_4_;
  fVar300 = auVar16._16_4_;
  fVar301 = auVar16._20_4_;
  fVar302 = auVar16._24_4_;
  fVar350 = auVar173._0_4_;
  fVar361 = auVar173._4_4_;
  fVar363 = auVar173._8_4_;
  fVar370 = auVar173._12_4_;
  fVar349 = auVar142._12_4_ + 1.0;
  fVar342 = auVar131._0_4_;
  fVar346 = auVar131._4_4_;
  fVar347 = auVar131._8_4_;
  fVar348 = auVar131._12_4_;
  fVar239 = fVar342 * auVar313._0_4_ + fVar364 * fVar276;
  fVar240 = fVar346 * auVar313._4_4_ + fVar369 * fVar278;
  fVar241 = fVar347 * auVar313._8_4_ + fVar371 * fVar213;
  fVar316 = fVar348 * auVar313._12_4_ + fVar374 * fVar215;
  fVar331 = fVar342 * auVar313._16_4_ + fVar300 * fVar276;
  fVar335 = fVar346 * auVar313._20_4_ + fVar301 * fVar278;
  fVar336 = fVar347 * auVar313._24_4_ + fVar302 * fVar213;
  fVar277 = auVar87._0_4_;
  fVar192 = auVar87._4_4_;
  fVar214 = auVar87._8_4_;
  fVar216 = auVar87._12_4_;
  fVar360 = fVar350 * fVar364 + auVar313._0_4_ * fVar277;
  fVar362 = fVar361 * fVar369 + auVar313._4_4_ * fVar192;
  fVar368 = fVar363 * fVar371 + auVar313._8_4_ * fVar214;
  fVar373 = fVar370 * fVar374 + auVar313._12_4_ * fVar216;
  fVar338 = fVar350 * fVar300 + auVar313._16_4_ * fVar277;
  fVar339 = fVar361 * fVar301 + auVar313._20_4_ * fVar192;
  fVar340 = fVar363 * fVar302 + auVar313._24_4_ * fVar214;
  fVar341 = fVar370 + fVar215;
  auVar199 = vshufps_avx(auVar208,auVar208,0xaa);
  auVar130 = vshufps_avx(auVar208,auVar208,0xff);
  fVar337 = fVar348 + 0.0;
  auVar173 = vshufps_avx(auVar170,auVar170,0xaa);
  auVar131 = vshufps_avx(auVar170,auVar170,0xff);
  auVar237._0_4_ =
       fVar364 * (auVar313._0_4_ * fVar276 + fVar364 * auVar187._0_4_) + auVar313._0_4_ * fVar239;
  auVar237._4_4_ =
       fVar369 * (auVar313._4_4_ * fVar278 + fVar369 * auVar187._4_4_) + auVar313._4_4_ * fVar240;
  auVar237._8_4_ =
       fVar371 * (auVar313._8_4_ * fVar213 + fVar371 * auVar187._8_4_) + auVar313._8_4_ * fVar241;
  auVar237._12_4_ =
       fVar374 * (auVar313._12_4_ * fVar215 + fVar374 * auVar187._12_4_) + auVar313._12_4_ * fVar316
  ;
  auVar237._16_4_ =
       fVar300 * (auVar313._16_4_ * fVar276 + fVar300 * auVar187._0_4_) + auVar313._16_4_ * fVar331;
  auVar237._20_4_ =
       fVar301 * (auVar313._20_4_ * fVar278 + fVar301 * auVar187._4_4_) + auVar313._20_4_ * fVar335;
  auVar237._24_4_ =
       fVar302 * (auVar313._24_4_ * fVar213 + fVar302 * auVar187._8_4_) + auVar313._24_4_ * fVar336;
  auVar237._28_4_ = auVar187._12_4_ + 1.0 + fVar216;
  auVar253._0_4_ =
       fVar364 * (fVar350 * auVar313._0_4_ + auVar142._0_4_ * fVar364) + auVar313._0_4_ * fVar360;
  auVar253._4_4_ =
       fVar369 * (fVar361 * auVar313._4_4_ + auVar142._4_4_ * fVar369) + auVar313._4_4_ * fVar362;
  auVar253._8_4_ =
       fVar371 * (fVar363 * auVar313._8_4_ + auVar142._8_4_ * fVar371) + auVar313._8_4_ * fVar368;
  auVar253._12_4_ =
       fVar374 * (fVar370 * auVar313._12_4_ + auVar142._12_4_ * fVar374) + auVar313._12_4_ * fVar373
  ;
  auVar253._16_4_ =
       fVar300 * (fVar350 * auVar313._16_4_ + auVar142._0_4_ * fVar300) + auVar313._16_4_ * fVar338;
  auVar253._20_4_ =
       fVar301 * (fVar361 * auVar313._20_4_ + auVar142._4_4_ * fVar301) + auVar313._20_4_ * fVar339;
  auVar253._24_4_ =
       fVar302 * (fVar363 * auVar313._24_4_ + auVar142._8_4_ * fVar302) + auVar313._24_4_ * fVar340;
  auVar253._28_4_ = auVar78._12_4_ + fVar216;
  auVar112._0_4_ =
       fVar364 * fVar239 + auVar313._0_4_ * (fVar342 * fVar364 + auVar272._0_4_ * auVar313._0_4_);
  auVar112._4_4_ =
       fVar369 * fVar240 + auVar313._4_4_ * (fVar346 * fVar369 + auVar272._4_4_ * auVar313._4_4_);
  auVar112._8_4_ =
       fVar371 * fVar241 + auVar313._8_4_ * (fVar347 * fVar371 + auVar272._8_4_ * auVar313._8_4_);
  auVar112._12_4_ =
       fVar374 * fVar316 + auVar313._12_4_ * (fVar348 * fVar374 + auVar272._12_4_ * auVar313._12_4_)
  ;
  auVar112._16_4_ =
       fVar300 * fVar331 + auVar313._16_4_ * (fVar342 * fVar300 + auVar272._0_4_ * auVar313._16_4_);
  auVar112._20_4_ =
       fVar301 * fVar335 + auVar313._20_4_ * (fVar346 * fVar301 + auVar272._4_4_ * auVar313._20_4_);
  auVar112._24_4_ =
       fVar302 * fVar336 + auVar313._24_4_ * (fVar347 * fVar302 + auVar272._8_4_ * auVar313._24_4_);
  auVar112._28_4_ = fVar215 + 1.0 + fVar337;
  auVar326._0_4_ =
       fVar364 * fVar360 + auVar313._0_4_ * (auVar78._0_4_ * auVar313._0_4_ + fVar364 * fVar277);
  auVar326._4_4_ =
       fVar369 * fVar362 + auVar313._4_4_ * (auVar78._4_4_ * auVar313._4_4_ + fVar369 * fVar192);
  auVar326._8_4_ =
       fVar371 * fVar368 + auVar313._8_4_ * (auVar78._8_4_ * auVar313._8_4_ + fVar371 * fVar214);
  auVar326._12_4_ =
       fVar374 * fVar373 + auVar313._12_4_ * (auVar78._12_4_ * auVar313._12_4_ + fVar374 * fVar216);
  auVar326._16_4_ =
       fVar300 * fVar338 + auVar313._16_4_ * (auVar78._0_4_ * auVar313._16_4_ + fVar300 * fVar277);
  auVar326._20_4_ =
       fVar301 * fVar339 + auVar313._20_4_ * (auVar78._4_4_ * auVar313._20_4_ + fVar301 * fVar192);
  auVar326._24_4_ =
       fVar302 * fVar340 + auVar313._24_4_ * (auVar78._8_4_ * auVar313._24_4_ + fVar302 * fVar214);
  auVar326._28_4_ = fVar337 + fVar216 + 0.0;
  local_220._0_4_ = fVar364 * auVar237._0_4_ + auVar313._0_4_ * auVar112._0_4_;
  local_220._4_4_ = fVar369 * auVar237._4_4_ + auVar313._4_4_ * auVar112._4_4_;
  local_220._8_4_ = fVar371 * auVar237._8_4_ + auVar313._8_4_ * auVar112._8_4_;
  local_220._12_4_ = fVar374 * auVar237._12_4_ + auVar313._12_4_ * auVar112._12_4_;
  local_220._16_4_ = fVar300 * auVar237._16_4_ + auVar313._16_4_ * auVar112._16_4_;
  local_220._20_4_ = fVar301 * auVar237._20_4_ + auVar313._20_4_ * auVar112._20_4_;
  local_220._24_4_ = fVar302 * auVar237._24_4_ + auVar313._24_4_ * auVar112._24_4_;
  local_220._28_4_ = fVar341 + fVar216 + 0.0;
  auVar212._0_4_ = fVar364 * auVar253._0_4_ + auVar313._0_4_ * auVar326._0_4_;
  auVar212._4_4_ = fVar369 * auVar253._4_4_ + auVar313._4_4_ * auVar326._4_4_;
  auVar212._8_4_ = fVar371 * auVar253._8_4_ + auVar313._8_4_ * auVar326._8_4_;
  auVar212._12_4_ = fVar374 * auVar253._12_4_ + auVar313._12_4_ * auVar326._12_4_;
  auVar212._16_4_ = fVar300 * auVar253._16_4_ + auVar313._16_4_ * auVar326._16_4_;
  auVar212._20_4_ = fVar301 * auVar253._20_4_ + auVar313._20_4_ * auVar326._20_4_;
  auVar212._24_4_ = fVar302 * auVar253._24_4_ + auVar313._24_4_ * auVar326._24_4_;
  auVar212._28_4_ = fVar341 + fVar337;
  auVar17 = vsubps_avx(auVar112,auVar237);
  auVar110 = vsubps_avx(auVar326,auVar253);
  local_600 = auVar88._0_4_;
  fStack_5fc = auVar88._4_4_;
  fStack_5f8 = auVar88._8_4_;
  fStack_5f4 = auVar88._12_4_;
  local_260 = local_600 * auVar17._0_4_ * 3.0;
  fStack_25c = fStack_5fc * auVar17._4_4_ * 3.0;
  auVar18._4_4_ = fStack_25c;
  auVar18._0_4_ = local_260;
  fStack_258 = fStack_5f8 * auVar17._8_4_ * 3.0;
  auVar18._8_4_ = fStack_258;
  fStack_254 = fStack_5f4 * auVar17._12_4_ * 3.0;
  auVar18._12_4_ = fStack_254;
  fStack_250 = local_600 * auVar17._16_4_ * 3.0;
  auVar18._16_4_ = fStack_250;
  fStack_24c = fStack_5fc * auVar17._20_4_ * 3.0;
  auVar18._20_4_ = fStack_24c;
  fStack_248 = fStack_5f8 * auVar17._24_4_ * 3.0;
  auVar18._24_4_ = fStack_248;
  auVar18._28_4_ = auVar17._28_4_;
  local_280 = local_600 * auVar110._0_4_ * 3.0;
  fStack_27c = fStack_5fc * auVar110._4_4_ * 3.0;
  auVar19._4_4_ = fStack_27c;
  auVar19._0_4_ = local_280;
  fStack_278 = fStack_5f8 * auVar110._8_4_ * 3.0;
  auVar19._8_4_ = fStack_278;
  fStack_274 = fStack_5f4 * auVar110._12_4_ * 3.0;
  auVar19._12_4_ = fStack_274;
  fStack_270 = local_600 * auVar110._16_4_ * 3.0;
  auVar19._16_4_ = fStack_270;
  fStack_26c = fStack_5fc * auVar110._20_4_ * 3.0;
  auVar19._20_4_ = fStack_26c;
  fStack_268 = fStack_5f8 * auVar110._24_4_ * 3.0;
  auVar19._24_4_ = fStack_268;
  auVar19._28_4_ = fVar341;
  auVar18 = vsubps_avx(local_220,auVar18);
  auVar110 = vperm2f128_avx(auVar18,auVar18,1);
  auVar110 = vshufps_avx(auVar110,auVar18,0x30);
  auVar110 = vshufps_avx(auVar18,auVar110,0x29);
  auVar19 = vsubps_avx(auVar212,auVar19);
  auVar18 = vperm2f128_avx(auVar19,auVar19,1);
  auVar18 = vshufps_avx(auVar18,auVar19,0x30);
  auVar19 = vshufps_avx(auVar19,auVar18,0x29);
  fVar339 = auVar173._0_4_;
  fVar340 = auVar173._4_4_;
  fVar372 = auVar173._8_4_;
  fVar215 = auVar199._12_4_;
  fVar346 = auVar131._0_4_;
  fVar348 = auVar131._4_4_;
  fVar360 = auVar131._8_4_;
  fVar362 = auVar131._12_4_;
  auVar88 = vshufps_avx(auVar273,auVar273,0xaa);
  fVar276 = auVar88._0_4_;
  fVar278 = auVar88._4_4_;
  fVar213 = auVar88._8_4_;
  fVar216 = auVar88._12_4_;
  fVar241 = auVar313._0_4_ * fVar276 + fVar339 * fVar364;
  fVar316 = auVar313._4_4_ * fVar278 + fVar340 * fVar369;
  fVar331 = auVar313._8_4_ * fVar213 + fVar372 * fVar371;
  fVar335 = auVar313._12_4_ * fVar216 + auVar173._12_4_ * fVar374;
  fVar336 = auVar313._16_4_ * fVar276 + fVar339 * fVar300;
  fVar337 = auVar313._20_4_ * fVar278 + fVar340 * fVar301;
  fVar342 = auVar313._24_4_ * fVar213 + fVar372 * fVar302;
  auVar88 = vshufps_avx(auVar273,auVar273,0xff);
  fVar277 = auVar88._0_4_;
  fVar192 = auVar88._4_4_;
  fVar214 = auVar88._8_4_;
  fVar239 = auVar88._12_4_;
  fVar347 = auVar313._0_4_ * fVar277 + fVar346 * fVar364;
  fVar350 = auVar313._4_4_ * fVar192 + fVar348 * fVar369;
  fVar361 = auVar313._8_4_ * fVar214 + fVar360 * fVar371;
  fVar363 = auVar313._12_4_ * fVar239 + fVar362 * fVar374;
  fVar368 = auVar313._16_4_ * fVar277 + fVar346 * fVar300;
  fVar370 = auVar313._20_4_ * fVar192 + fVar348 * fVar301;
  fVar373 = auVar313._24_4_ * fVar214 + fVar360 * fVar302;
  auVar88 = vshufps_avx(auVar227,auVar227,0xaa);
  fVar338 = auVar88._12_4_ + fVar216;
  auVar187 = vshufps_avx(auVar227,auVar227,0xff);
  fVar240 = auVar187._12_4_;
  auVar113._0_4_ =
       fVar364 * (fVar339 * auVar313._0_4_ + fVar364 * auVar199._0_4_) + auVar313._0_4_ * fVar241;
  auVar113._4_4_ =
       fVar369 * (fVar340 * auVar313._4_4_ + fVar369 * auVar199._4_4_) + auVar313._4_4_ * fVar316;
  auVar113._8_4_ =
       fVar371 * (fVar372 * auVar313._8_4_ + fVar371 * auVar199._8_4_) + auVar313._8_4_ * fVar331;
  auVar113._12_4_ =
       fVar374 * (auVar173._12_4_ * auVar313._12_4_ + fVar374 * fVar215) + auVar313._12_4_ * fVar335
  ;
  auVar113._16_4_ =
       fVar300 * (fVar339 * auVar313._16_4_ + fVar300 * auVar199._0_4_) + auVar313._16_4_ * fVar336;
  auVar113._20_4_ =
       fVar301 * (fVar340 * auVar313._20_4_ + fVar301 * auVar199._4_4_) + auVar313._20_4_ * fVar337;
  auVar113._24_4_ =
       fVar302 * (fVar372 * auVar313._24_4_ + fVar302 * auVar199._8_4_) + auVar313._24_4_ * fVar342;
  auVar113._28_4_ = auVar19._28_4_ + fVar215 + fVar240;
  auVar147._0_4_ =
       fVar364 * (fVar346 * auVar313._0_4_ + auVar130._0_4_ * fVar364) + auVar313._0_4_ * fVar347;
  auVar147._4_4_ =
       fVar369 * (fVar348 * auVar313._4_4_ + auVar130._4_4_ * fVar369) + auVar313._4_4_ * fVar350;
  auVar147._8_4_ =
       fVar371 * (fVar360 * auVar313._8_4_ + auVar130._8_4_ * fVar371) + auVar313._8_4_ * fVar361;
  auVar147._12_4_ =
       fVar374 * (fVar362 * auVar313._12_4_ + auVar130._12_4_ * fVar374) + auVar313._12_4_ * fVar363
  ;
  auVar147._16_4_ =
       fVar300 * (fVar346 * auVar313._16_4_ + auVar130._0_4_ * fVar300) + auVar313._16_4_ * fVar368;
  auVar147._20_4_ =
       fVar301 * (fVar348 * auVar313._20_4_ + auVar130._4_4_ * fVar301) + auVar313._20_4_ * fVar370;
  auVar147._24_4_ =
       fVar302 * (fVar360 * auVar313._24_4_ + auVar130._8_4_ * fVar302) + auVar313._24_4_ * fVar373;
  auVar147._28_4_ = fVar215 + auVar18._28_4_ + fVar240;
  auVar18 = vperm2f128_avx(local_220,local_220,1);
  auVar18 = vshufps_avx(auVar18,local_220,0x30);
  auVar111 = vshufps_avx(local_220,auVar18,0x29);
  auVar254._0_4_ =
       auVar313._0_4_ * (auVar88._0_4_ * auVar313._0_4_ + fVar364 * fVar276) + fVar364 * fVar241;
  auVar254._4_4_ =
       auVar313._4_4_ * (auVar88._4_4_ * auVar313._4_4_ + fVar369 * fVar278) + fVar369 * fVar316;
  auVar254._8_4_ =
       auVar313._8_4_ * (auVar88._8_4_ * auVar313._8_4_ + fVar371 * fVar213) + fVar371 * fVar331;
  auVar254._12_4_ =
       auVar313._12_4_ * (auVar88._12_4_ * auVar313._12_4_ + fVar374 * fVar216) + fVar374 * fVar335;
  auVar254._16_4_ =
       auVar313._16_4_ * (auVar88._0_4_ * auVar313._16_4_ + fVar300 * fVar276) + fVar300 * fVar336;
  auVar254._20_4_ =
       auVar313._20_4_ * (auVar88._4_4_ * auVar313._20_4_ + fVar301 * fVar278) + fVar301 * fVar337;
  auVar254._24_4_ =
       auVar313._24_4_ * (auVar88._8_4_ * auVar313._24_4_ + fVar302 * fVar213) + fVar302 * fVar342;
  auVar254._28_4_ = fVar338 + fVar349 + auVar253._28_4_;
  auVar292._0_4_ =
       fVar364 * fVar347 + auVar313._0_4_ * (auVar313._0_4_ * auVar187._0_4_ + fVar364 * fVar277);
  auVar292._4_4_ =
       fVar369 * fVar350 + auVar313._4_4_ * (auVar313._4_4_ * auVar187._4_4_ + fVar369 * fVar192);
  auVar292._8_4_ =
       fVar371 * fVar361 + auVar313._8_4_ * (auVar313._8_4_ * auVar187._8_4_ + fVar371 * fVar214);
  auVar292._12_4_ =
       fVar374 * fVar363 + auVar313._12_4_ * (auVar313._12_4_ * fVar240 + fVar374 * fVar239);
  auVar292._16_4_ =
       fVar300 * fVar368 + auVar313._16_4_ * (auVar313._16_4_ * auVar187._0_4_ + fVar300 * fVar277);
  auVar292._20_4_ =
       fVar301 * fVar370 + auVar313._20_4_ * (auVar313._20_4_ * auVar187._4_4_ + fVar301 * fVar192);
  auVar292._24_4_ =
       fVar302 * fVar373 + auVar313._24_4_ * (auVar313._24_4_ * auVar187._8_4_ + fVar302 * fVar214);
  auVar292._28_4_ = fVar349 + fVar362 + fVar240 + fVar239;
  auVar275._0_4_ = fVar364 * auVar113._0_4_ + auVar313._0_4_ * auVar254._0_4_;
  auVar275._4_4_ = fVar369 * auVar113._4_4_ + auVar313._4_4_ * auVar254._4_4_;
  auVar275._8_4_ = fVar371 * auVar113._8_4_ + auVar313._8_4_ * auVar254._8_4_;
  auVar275._12_4_ = fVar374 * auVar113._12_4_ + auVar313._12_4_ * auVar254._12_4_;
  auVar275._16_4_ = fVar300 * auVar113._16_4_ + auVar313._16_4_ * auVar254._16_4_;
  auVar275._20_4_ = fVar301 * auVar113._20_4_ + auVar313._20_4_ * auVar254._20_4_;
  auVar275._24_4_ = fVar302 * auVar113._24_4_ + auVar313._24_4_ * auVar254._24_4_;
  auVar275._28_4_ = fVar338 + fVar240 + fVar239;
  auVar299._0_4_ = fVar364 * auVar147._0_4_ + auVar313._0_4_ * auVar292._0_4_;
  auVar299._4_4_ = fVar369 * auVar147._4_4_ + auVar313._4_4_ * auVar292._4_4_;
  auVar299._8_4_ = fVar371 * auVar147._8_4_ + auVar313._8_4_ * auVar292._8_4_;
  auVar299._12_4_ = fVar374 * auVar147._12_4_ + auVar313._12_4_ * auVar292._12_4_;
  auVar299._16_4_ = fVar300 * auVar147._16_4_ + auVar313._16_4_ * auVar292._16_4_;
  auVar299._20_4_ = fVar301 * auVar147._20_4_ + auVar313._20_4_ * auVar292._20_4_;
  auVar299._24_4_ = fVar302 * auVar147._24_4_ + auVar313._24_4_ * auVar292._24_4_;
  auVar299._28_4_ = auVar16._28_4_ + auVar313._28_4_;
  auVar20 = vsubps_avx(auVar254,auVar113);
  auVar18 = vsubps_avx(auVar292,auVar147);
  local_2a0 = local_600 * auVar20._0_4_ * 3.0;
  fStack_29c = fStack_5fc * auVar20._4_4_ * 3.0;
  auVar16._4_4_ = fStack_29c;
  auVar16._0_4_ = local_2a0;
  fStack_298 = fStack_5f8 * auVar20._8_4_ * 3.0;
  auVar16._8_4_ = fStack_298;
  fStack_294 = fStack_5f4 * auVar20._12_4_ * 3.0;
  auVar16._12_4_ = fStack_294;
  fStack_290 = local_600 * auVar20._16_4_ * 3.0;
  auVar16._16_4_ = fStack_290;
  fStack_28c = fStack_5fc * auVar20._20_4_ * 3.0;
  auVar16._20_4_ = fStack_28c;
  fStack_288 = fStack_5f8 * auVar20._24_4_ * 3.0;
  auVar16._24_4_ = fStack_288;
  auVar16._28_4_ = auVar20._28_4_;
  local_2c0 = local_600 * auVar18._0_4_ * 3.0;
  fStack_2bc = fStack_5fc * auVar18._4_4_ * 3.0;
  auVar21._4_4_ = fStack_2bc;
  auVar21._0_4_ = local_2c0;
  fStack_2b8 = fStack_5f8 * auVar18._8_4_ * 3.0;
  auVar21._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_5f4 * auVar18._12_4_ * 3.0;
  auVar21._12_4_ = fStack_2b4;
  fStack_2b0 = local_600 * auVar18._16_4_ * 3.0;
  auVar21._16_4_ = fStack_2b0;
  fStack_2ac = fStack_5fc * auVar18._20_4_ * 3.0;
  auVar21._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_5f8 * auVar18._24_4_ * 3.0;
  auVar21._24_4_ = fStack_2a8;
  auVar21._28_4_ = auVar254._28_4_;
  auVar18 = vperm2f128_avx(auVar275,auVar275,1);
  auVar18 = vshufps_avx(auVar18,auVar275,0x30);
  auVar112 = vshufps_avx(auVar275,auVar18,0x29);
  auVar16 = vsubps_avx(auVar275,auVar16);
  auVar18 = vperm2f128_avx(auVar16,auVar16,1);
  auVar18 = vshufps_avx(auVar18,auVar16,0x30);
  auVar18 = vshufps_avx(auVar16,auVar18,0x29);
  auVar21 = vsubps_avx(auVar299,auVar21);
  auVar16 = vperm2f128_avx(auVar21,auVar21,1);
  auVar16 = vshufps_avx(auVar16,auVar21,0x30);
  local_200 = vshufps_avx(auVar21,auVar16,0x29);
  auVar22 = vsubps_avx(auVar275,local_220);
  auVar113 = vsubps_avx(auVar112,auVar111);
  fVar276 = auVar113._0_4_ + auVar22._0_4_;
  fVar277 = auVar113._4_4_ + auVar22._4_4_;
  fVar278 = auVar113._8_4_ + auVar22._8_4_;
  fVar192 = auVar113._12_4_ + auVar22._12_4_;
  fVar213 = auVar113._16_4_ + auVar22._16_4_;
  fVar214 = auVar113._20_4_ + auVar22._20_4_;
  fVar215 = auVar113._24_4_ + auVar22._24_4_;
  auVar16 = vperm2f128_avx(auVar212,auVar212,1);
  auVar16 = vshufps_avx(auVar16,auVar212,0x30);
  local_240 = vshufps_avx(auVar212,auVar16,0x29);
  auVar16 = vperm2f128_avx(auVar299,auVar299,1);
  auVar16 = vshufps_avx(auVar16,auVar299,0x30);
  auVar21 = vshufps_avx(auVar299,auVar16,0x29);
  auVar16 = vsubps_avx(auVar299,auVar212);
  auVar147 = vsubps_avx(auVar21,local_240);
  fVar216 = auVar147._0_4_ + auVar16._0_4_;
  fVar239 = auVar147._4_4_ + auVar16._4_4_;
  fVar240 = auVar147._8_4_ + auVar16._8_4_;
  fVar241 = auVar147._12_4_ + auVar16._12_4_;
  fVar316 = auVar147._16_4_ + auVar16._16_4_;
  fVar331 = auVar147._20_4_ + auVar16._20_4_;
  fVar335 = auVar147._24_4_ + auVar16._24_4_;
  auVar23._4_4_ = fVar277 * auVar212._4_4_;
  auVar23._0_4_ = fVar276 * auVar212._0_4_;
  auVar23._8_4_ = fVar278 * auVar212._8_4_;
  auVar23._12_4_ = fVar192 * auVar212._12_4_;
  auVar23._16_4_ = fVar213 * auVar212._16_4_;
  auVar23._20_4_ = fVar214 * auVar212._20_4_;
  auVar23._24_4_ = fVar215 * auVar212._24_4_;
  auVar23._28_4_ = auVar16._28_4_;
  auVar24._4_4_ = fVar239 * local_220._4_4_;
  auVar24._0_4_ = fVar216 * local_220._0_4_;
  auVar24._8_4_ = fVar240 * local_220._8_4_;
  auVar24._12_4_ = fVar241 * local_220._12_4_;
  auVar24._16_4_ = fVar316 * local_220._16_4_;
  auVar24._20_4_ = fVar331 * local_220._20_4_;
  auVar24._24_4_ = fVar335 * local_220._24_4_;
  auVar24._28_4_ = fVar338;
  auVar23 = vsubps_avx(auVar23,auVar24);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar17._28_4_;
  local_280 = local_280 + auVar212._0_4_;
  fStack_27c = fStack_27c + auVar212._4_4_;
  fStack_278 = fStack_278 + auVar212._8_4_;
  fStack_274 = fStack_274 + auVar212._12_4_;
  fStack_270 = fStack_270 + auVar212._16_4_;
  fStack_26c = fStack_26c + auVar212._20_4_;
  fStack_268 = fStack_268 + auVar212._24_4_;
  fStack_264 = fVar341 + auVar212._28_4_;
  auVar17._4_4_ = fVar277 * fStack_27c;
  auVar17._0_4_ = fVar276 * local_280;
  auVar17._8_4_ = fVar278 * fStack_278;
  auVar17._12_4_ = fVar192 * fStack_274;
  auVar17._16_4_ = fVar213 * fStack_270;
  auVar17._20_4_ = fVar214 * fStack_26c;
  auVar17._24_4_ = fVar215 * fStack_268;
  auVar17._28_4_ = fVar341;
  auVar25._4_4_ = fVar239 * fStack_25c;
  auVar25._0_4_ = fVar216 * local_260;
  auVar25._8_4_ = fVar240 * fStack_258;
  auVar25._12_4_ = fVar241 * fStack_254;
  auVar25._16_4_ = fVar316 * fStack_250;
  auVar25._20_4_ = fVar331 * fStack_24c;
  auVar25._24_4_ = fVar335 * fStack_248;
  auVar25._28_4_ = fVar341 + auVar212._28_4_;
  auVar17 = vsubps_avx(auVar17,auVar25);
  local_700 = auVar19._0_4_;
  fStack_6fc = auVar19._4_4_;
  fStack_6f8 = auVar19._8_4_;
  fStack_6f4 = auVar19._12_4_;
  fStack_6f0 = auVar19._16_4_;
  fStack_6ec = auVar19._20_4_;
  fStack_6e8 = auVar19._24_4_;
  auVar26._4_4_ = fVar277 * fStack_6fc;
  auVar26._0_4_ = fVar276 * local_700;
  auVar26._8_4_ = fVar278 * fStack_6f8;
  auVar26._12_4_ = fVar192 * fStack_6f4;
  auVar26._16_4_ = fVar213 * fStack_6f0;
  auVar26._20_4_ = fVar214 * fStack_6ec;
  auVar26._24_4_ = fVar215 * fStack_6e8;
  auVar26._28_4_ = fVar341;
  local_6e0 = auVar110._0_4_;
  fStack_6dc = auVar110._4_4_;
  fStack_6d8 = auVar110._8_4_;
  fStack_6d4 = auVar110._12_4_;
  fStack_6d0 = auVar110._16_4_;
  fStack_6cc = auVar110._20_4_;
  fStack_6c8 = auVar110._24_4_;
  auVar27._4_4_ = fVar239 * fStack_6dc;
  auVar27._0_4_ = fVar216 * local_6e0;
  auVar27._8_4_ = fVar240 * fStack_6d8;
  auVar27._12_4_ = fVar241 * fStack_6d4;
  auVar27._16_4_ = fVar316 * fStack_6d0;
  auVar27._20_4_ = fVar331 * fStack_6cc;
  auVar27._24_4_ = fVar335 * fStack_6c8;
  auVar27._28_4_ = local_220._28_4_;
  auVar24 = vsubps_avx(auVar26,auVar27);
  auVar28._4_4_ = local_240._4_4_ * fVar277;
  auVar28._0_4_ = local_240._0_4_ * fVar276;
  auVar28._8_4_ = local_240._8_4_ * fVar278;
  auVar28._12_4_ = local_240._12_4_ * fVar192;
  auVar28._16_4_ = local_240._16_4_ * fVar213;
  auVar28._20_4_ = local_240._20_4_ * fVar214;
  auVar28._24_4_ = local_240._24_4_ * fVar215;
  auVar28._28_4_ = fVar341;
  auVar29._4_4_ = auVar111._4_4_ * fVar239;
  auVar29._0_4_ = auVar111._0_4_ * fVar216;
  auVar29._8_4_ = auVar111._8_4_ * fVar240;
  auVar29._12_4_ = auVar111._12_4_ * fVar241;
  auVar29._16_4_ = auVar111._16_4_ * fVar316;
  auVar29._20_4_ = auVar111._20_4_ * fVar331;
  auVar29._24_4_ = auVar111._24_4_ * fVar335;
  auVar29._28_4_ = local_240._28_4_;
  local_600 = auVar18._0_4_;
  fStack_5fc = auVar18._4_4_;
  fStack_5f8 = auVar18._8_4_;
  fStack_5f4 = auVar18._12_4_;
  fStack_5f0 = auVar18._16_4_;
  fStack_5ec = auVar18._20_4_;
  fStack_5e8 = auVar18._24_4_;
  auVar25 = vsubps_avx(auVar28,auVar29);
  auVar30._4_4_ = auVar299._4_4_ * fVar277;
  auVar30._0_4_ = auVar299._0_4_ * fVar276;
  auVar30._8_4_ = auVar299._8_4_ * fVar278;
  auVar30._12_4_ = auVar299._12_4_ * fVar192;
  auVar30._16_4_ = auVar299._16_4_ * fVar213;
  auVar30._20_4_ = auVar299._20_4_ * fVar214;
  auVar30._24_4_ = auVar299._24_4_ * fVar215;
  auVar30._28_4_ = fVar341;
  auVar31._4_4_ = fVar239 * auVar275._4_4_;
  auVar31._0_4_ = fVar216 * auVar275._0_4_;
  auVar31._8_4_ = fVar240 * auVar275._8_4_;
  auVar31._12_4_ = fVar241 * auVar275._12_4_;
  auVar31._16_4_ = fVar316 * auVar275._16_4_;
  auVar31._20_4_ = fVar331 * auVar275._20_4_;
  auVar31._24_4_ = fVar335 * auVar275._24_4_;
  auVar31._28_4_ = fStack_244;
  auVar26 = vsubps_avx(auVar30,auVar31);
  local_2a0 = auVar275._0_4_ + local_2a0;
  fStack_29c = auVar275._4_4_ + fStack_29c;
  fStack_298 = auVar275._8_4_ + fStack_298;
  fStack_294 = auVar275._12_4_ + fStack_294;
  fStack_290 = auVar275._16_4_ + fStack_290;
  fStack_28c = auVar275._20_4_ + fStack_28c;
  fStack_288 = auVar275._24_4_ + fStack_288;
  fStack_284 = auVar275._28_4_ + auVar20._28_4_;
  local_2c0 = auVar299._0_4_ + local_2c0;
  fStack_2bc = auVar299._4_4_ + fStack_2bc;
  fStack_2b8 = auVar299._8_4_ + fStack_2b8;
  fStack_2b4 = auVar299._12_4_ + fStack_2b4;
  fStack_2b0 = auVar299._16_4_ + fStack_2b0;
  fStack_2ac = auVar299._20_4_ + fStack_2ac;
  fStack_2a8 = auVar299._24_4_ + fStack_2a8;
  fStack_2a4 = auVar299._28_4_ + auVar254._28_4_;
  auVar20._4_4_ = fVar277 * fStack_2bc;
  auVar20._0_4_ = fVar276 * local_2c0;
  auVar20._8_4_ = fVar278 * fStack_2b8;
  auVar20._12_4_ = fVar192 * fStack_2b4;
  auVar20._16_4_ = fVar213 * fStack_2b0;
  auVar20._20_4_ = fVar214 * fStack_2ac;
  auVar20._24_4_ = fVar215 * fStack_2a8;
  auVar20._28_4_ = auVar299._28_4_ + auVar254._28_4_;
  auVar32._4_4_ = fStack_29c * fVar239;
  auVar32._0_4_ = local_2a0 * fVar216;
  auVar32._8_4_ = fStack_298 * fVar240;
  auVar32._12_4_ = fStack_294 * fVar241;
  auVar32._16_4_ = fStack_290 * fVar316;
  auVar32._20_4_ = fStack_28c * fVar331;
  auVar32._24_4_ = fStack_288 * fVar335;
  auVar32._28_4_ = fStack_284;
  auVar20 = vsubps_avx(auVar20,auVar32);
  auVar33._4_4_ = fVar277 * local_200._4_4_;
  auVar33._0_4_ = fVar276 * local_200._0_4_;
  auVar33._8_4_ = fVar278 * local_200._8_4_;
  auVar33._12_4_ = fVar192 * local_200._12_4_;
  auVar33._16_4_ = fVar213 * local_200._16_4_;
  auVar33._20_4_ = fVar214 * local_200._20_4_;
  auVar33._24_4_ = fVar215 * local_200._24_4_;
  auVar33._28_4_ = fStack_284;
  auVar34._4_4_ = fVar239 * fStack_5fc;
  auVar34._0_4_ = fVar216 * local_600;
  auVar34._8_4_ = fVar240 * fStack_5f8;
  auVar34._12_4_ = fVar241 * fStack_5f4;
  auVar34._16_4_ = fVar316 * fStack_5f0;
  auVar34._20_4_ = fVar331 * fStack_5ec;
  auVar34._24_4_ = fVar335 * fStack_5e8;
  auVar34._28_4_ = local_200._28_4_;
  auVar27 = vsubps_avx(auVar33,auVar34);
  auVar35._4_4_ = fVar277 * auVar21._4_4_;
  auVar35._0_4_ = fVar276 * auVar21._0_4_;
  auVar35._8_4_ = fVar278 * auVar21._8_4_;
  auVar35._12_4_ = fVar192 * auVar21._12_4_;
  auVar35._16_4_ = fVar213 * auVar21._16_4_;
  auVar35._20_4_ = fVar214 * auVar21._20_4_;
  auVar35._24_4_ = fVar215 * auVar21._24_4_;
  auVar35._28_4_ = auVar113._28_4_ + auVar22._28_4_;
  auVar22._4_4_ = auVar112._4_4_ * fVar239;
  auVar22._0_4_ = auVar112._0_4_ * fVar216;
  auVar22._8_4_ = auVar112._8_4_ * fVar240;
  auVar22._12_4_ = auVar112._12_4_ * fVar241;
  auVar22._16_4_ = auVar112._16_4_ * fVar316;
  auVar22._20_4_ = auVar112._20_4_ * fVar331;
  auVar22._24_4_ = auVar112._24_4_ * fVar335;
  auVar22._28_4_ = auVar147._28_4_ + auVar16._28_4_;
  auVar22 = vsubps_avx(auVar35,auVar22);
  auVar18 = vminps_avx(auVar23,auVar17);
  auVar110 = vmaxps_avx(auVar23,auVar17);
  auVar19 = vminps_avx(auVar24,auVar25);
  auVar19 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(auVar24,auVar25);
  auVar110 = vmaxps_avx(auVar110,auVar18);
  auVar16 = vminps_avx(auVar26,auVar20);
  auVar18 = vmaxps_avx(auVar26,auVar20);
  auVar17 = vminps_avx(auVar27,auVar22);
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar17 = vminps_avx(auVar19,auVar17);
  auVar19 = vmaxps_avx(auVar27,auVar22);
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(auVar110,auVar18);
  auVar110 = vcmpps_avx(auVar17,local_1c0,2);
  auVar18 = vcmpps_avx(auVar18,local_1e0,5);
  auVar110 = vandps_avx(auVar18,auVar110);
  auVar18 = local_2e0 & auVar110;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0x7f,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar18 >> 0xbf,0) != '\0') ||
      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0') {
    auVar18 = vsubps_avx(auVar111,local_220);
    auVar19 = vsubps_avx(auVar112,auVar275);
    fVar277 = auVar18._0_4_ + auVar19._0_4_;
    fVar278 = auVar18._4_4_ + auVar19._4_4_;
    fVar192 = auVar18._8_4_ + auVar19._8_4_;
    fVar213 = auVar18._12_4_ + auVar19._12_4_;
    fVar214 = auVar18._16_4_ + auVar19._16_4_;
    fVar215 = auVar18._20_4_ + auVar19._20_4_;
    fVar216 = auVar18._24_4_ + auVar19._24_4_;
    auVar17 = vsubps_avx(local_240,auVar212);
    auVar20 = vsubps_avx(auVar21,auVar299);
    fVar239 = auVar17._0_4_ + auVar20._0_4_;
    fVar240 = auVar17._4_4_ + auVar20._4_4_;
    fVar241 = auVar17._8_4_ + auVar20._8_4_;
    fVar316 = auVar17._12_4_ + auVar20._12_4_;
    fVar331 = auVar17._16_4_ + auVar20._16_4_;
    fVar335 = auVar17._20_4_ + auVar20._20_4_;
    fVar336 = auVar17._24_4_ + auVar20._24_4_;
    fVar276 = auVar20._28_4_;
    auVar36._4_4_ = auVar212._4_4_ * fVar278;
    auVar36._0_4_ = auVar212._0_4_ * fVar277;
    auVar36._8_4_ = auVar212._8_4_ * fVar192;
    auVar36._12_4_ = auVar212._12_4_ * fVar213;
    auVar36._16_4_ = auVar212._16_4_ * fVar214;
    auVar36._20_4_ = auVar212._20_4_ * fVar215;
    auVar36._24_4_ = auVar212._24_4_ * fVar216;
    auVar36._28_4_ = auVar212._28_4_;
    auVar37._4_4_ = local_220._4_4_ * fVar240;
    auVar37._0_4_ = local_220._0_4_ * fVar239;
    auVar37._8_4_ = local_220._8_4_ * fVar241;
    auVar37._12_4_ = local_220._12_4_ * fVar316;
    auVar37._16_4_ = local_220._16_4_ * fVar331;
    auVar37._20_4_ = local_220._20_4_ * fVar335;
    auVar37._24_4_ = local_220._24_4_ * fVar336;
    auVar37._28_4_ = local_220._28_4_;
    auVar20 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = fVar278 * fStack_27c;
    auVar38._0_4_ = fVar277 * local_280;
    auVar38._8_4_ = fVar192 * fStack_278;
    auVar38._12_4_ = fVar213 * fStack_274;
    auVar38._16_4_ = fVar214 * fStack_270;
    auVar38._20_4_ = fVar215 * fStack_26c;
    auVar38._24_4_ = fVar216 * fStack_268;
    auVar38._28_4_ = auVar212._28_4_;
    auVar39._4_4_ = fVar240 * fStack_25c;
    auVar39._0_4_ = fVar239 * local_260;
    auVar39._8_4_ = fVar241 * fStack_258;
    auVar39._12_4_ = fVar316 * fStack_254;
    auVar39._16_4_ = fVar331 * fStack_250;
    auVar39._20_4_ = fVar335 * fStack_24c;
    auVar39._24_4_ = fVar336 * fStack_248;
    auVar39._28_4_ = fVar276;
    auVar22 = vsubps_avx(auVar38,auVar39);
    auVar40._4_4_ = fVar278 * fStack_6fc;
    auVar40._0_4_ = fVar277 * local_700;
    auVar40._8_4_ = fVar192 * fStack_6f8;
    auVar40._12_4_ = fVar213 * fStack_6f4;
    auVar40._16_4_ = fVar214 * fStack_6f0;
    auVar40._20_4_ = fVar215 * fStack_6ec;
    auVar40._24_4_ = fVar216 * fStack_6e8;
    auVar40._28_4_ = fVar276;
    auVar41._4_4_ = fVar240 * fStack_6dc;
    auVar41._0_4_ = fVar239 * local_6e0;
    auVar41._8_4_ = fVar241 * fStack_6d8;
    auVar41._12_4_ = fVar316 * fStack_6d4;
    auVar41._16_4_ = fVar331 * fStack_6d0;
    auVar41._20_4_ = fVar335 * fStack_6cc;
    auVar41._24_4_ = fVar336 * fStack_6c8;
    auVar41._28_4_ = auVar16._28_4_;
    auVar113 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = local_240._4_4_ * fVar278;
    auVar42._0_4_ = local_240._0_4_ * fVar277;
    auVar42._8_4_ = local_240._8_4_ * fVar192;
    auVar42._12_4_ = local_240._12_4_ * fVar213;
    auVar42._16_4_ = local_240._16_4_ * fVar214;
    auVar42._20_4_ = local_240._20_4_ * fVar215;
    auVar42._24_4_ = local_240._24_4_ * fVar216;
    auVar42._28_4_ = auVar16._28_4_;
    auVar43._4_4_ = auVar111._4_4_ * fVar240;
    auVar43._0_4_ = auVar111._0_4_ * fVar239;
    auVar43._8_4_ = auVar111._8_4_ * fVar241;
    auVar43._12_4_ = auVar111._12_4_ * fVar316;
    auVar43._16_4_ = auVar111._16_4_ * fVar331;
    auVar43._20_4_ = auVar111._20_4_ * fVar335;
    uVar74 = auVar111._28_4_;
    auVar43._24_4_ = auVar111._24_4_ * fVar336;
    auVar43._28_4_ = uVar74;
    auVar111 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = auVar299._4_4_ * fVar278;
    auVar44._0_4_ = auVar299._0_4_ * fVar277;
    auVar44._8_4_ = auVar299._8_4_ * fVar192;
    auVar44._12_4_ = auVar299._12_4_ * fVar213;
    auVar44._16_4_ = auVar299._16_4_ * fVar214;
    auVar44._20_4_ = auVar299._20_4_ * fVar215;
    auVar44._24_4_ = auVar299._24_4_ * fVar216;
    auVar44._28_4_ = uVar74;
    auVar45._4_4_ = auVar275._4_4_ * fVar240;
    auVar45._0_4_ = auVar275._0_4_ * fVar239;
    auVar45._8_4_ = auVar275._8_4_ * fVar241;
    auVar45._12_4_ = auVar275._12_4_ * fVar316;
    auVar45._16_4_ = auVar275._16_4_ * fVar331;
    auVar45._20_4_ = auVar275._20_4_ * fVar335;
    auVar45._24_4_ = auVar275._24_4_ * fVar336;
    auVar45._28_4_ = auVar275._28_4_;
    auVar147 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar278 * fStack_2bc;
    auVar46._0_4_ = fVar277 * local_2c0;
    auVar46._8_4_ = fVar192 * fStack_2b8;
    auVar46._12_4_ = fVar213 * fStack_2b4;
    auVar46._16_4_ = fVar214 * fStack_2b0;
    auVar46._20_4_ = fVar215 * fStack_2ac;
    auVar46._24_4_ = fVar216 * fStack_2a8;
    auVar46._28_4_ = uVar74;
    auVar47._4_4_ = fVar240 * fStack_29c;
    auVar47._0_4_ = fVar239 * local_2a0;
    auVar47._8_4_ = fVar241 * fStack_298;
    auVar47._12_4_ = fVar316 * fStack_294;
    auVar47._16_4_ = fVar331 * fStack_290;
    auVar47._20_4_ = fVar335 * fStack_28c;
    auVar47._24_4_ = fVar336 * fStack_288;
    auVar47._28_4_ = auVar299._28_4_;
    auVar23 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = fVar278 * local_200._4_4_;
    auVar48._0_4_ = fVar277 * local_200._0_4_;
    auVar48._8_4_ = fVar192 * local_200._8_4_;
    auVar48._12_4_ = fVar213 * local_200._12_4_;
    auVar48._16_4_ = fVar214 * local_200._16_4_;
    auVar48._20_4_ = fVar215 * local_200._20_4_;
    auVar48._24_4_ = fVar216 * local_200._24_4_;
    auVar48._28_4_ = auVar299._28_4_;
    auVar49._4_4_ = fStack_5fc * fVar240;
    auVar49._0_4_ = local_600 * fVar239;
    auVar49._8_4_ = fStack_5f8 * fVar241;
    auVar49._12_4_ = fStack_5f4 * fVar316;
    auVar49._16_4_ = fStack_5f0 * fVar331;
    auVar49._20_4_ = fStack_5ec * fVar335;
    auVar49._24_4_ = fStack_5e8 * fVar336;
    auVar49._28_4_ = local_240._28_4_;
    auVar24 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = fVar278 * auVar21._4_4_;
    auVar50._0_4_ = fVar277 * auVar21._0_4_;
    auVar50._8_4_ = fVar192 * auVar21._8_4_;
    auVar50._12_4_ = fVar213 * auVar21._12_4_;
    auVar50._16_4_ = fVar214 * auVar21._16_4_;
    auVar50._20_4_ = fVar215 * auVar21._20_4_;
    auVar50._24_4_ = fVar216 * auVar21._24_4_;
    auVar50._28_4_ = auVar18._28_4_ + auVar19._28_4_;
    auVar51._4_4_ = auVar112._4_4_ * fVar240;
    auVar51._0_4_ = auVar112._0_4_ * fVar239;
    auVar51._8_4_ = auVar112._8_4_ * fVar241;
    auVar51._12_4_ = auVar112._12_4_ * fVar316;
    auVar51._16_4_ = auVar112._16_4_ * fVar331;
    auVar51._20_4_ = auVar112._20_4_ * fVar335;
    auVar51._24_4_ = auVar112._24_4_ * fVar336;
    auVar51._28_4_ = auVar17._28_4_ + fVar276;
    auVar112 = vsubps_avx(auVar50,auVar51);
    auVar19 = vminps_avx(auVar20,auVar22);
    auVar18 = vmaxps_avx(auVar20,auVar22);
    auVar16 = vminps_avx(auVar113,auVar111);
    auVar16 = vminps_avx(auVar19,auVar16);
    auVar19 = vmaxps_avx(auVar113,auVar111);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar17 = vminps_avx(auVar147,auVar23);
    auVar19 = vmaxps_avx(auVar147,auVar23);
    auVar111 = vminps_avx(auVar24,auVar112);
    auVar17 = vminps_avx(auVar17,auVar111);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar24,auVar112);
    auVar19 = vmaxps_avx(auVar19,auVar16);
    auVar19 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vcmpps_avx(auVar17,local_1c0,2);
    auVar19 = vcmpps_avx(auVar19,local_1e0,5);
    auVar18 = vandps_avx(auVar19,auVar18);
    auVar110 = vandps_avx(local_2e0,auVar110);
    auVar19 = auVar110 & auVar18;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar110 = vandps_avx(auVar18,auVar110);
      uVar64 = vmovmskps_avx(auVar110);
      if (uVar64 != 0) {
        auStack_4b0[uVar69] = uVar64 & 0xff;
        uVar5 = vmovlps_avx(local_420);
        *(undefined8 *)(afStack_340 + uVar69 * 2) = uVar5;
        uVar6 = vmovlps_avx(auVar79);
        auStack_1a0[uVar69] = uVar6;
        uVar69 = (ulong)((int)uVar69 + 1);
      }
    }
  }
LAB_0091fe98:
  do {
    do {
      do {
        do {
          if ((int)uVar69 == 0) {
            auVar53 = ZEXT812(0) << 0x20;
            if (bVar75) goto LAB_00920f27;
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar109._4_4_ = uVar74;
            auVar109._0_4_ = uVar74;
            auVar109._8_4_ = uVar74;
            auVar109._12_4_ = uVar74;
            auVar88 = vcmpps_avx(local_430,auVar109,2);
            uVar65 = vmovmskps_avx(auVar88);
            uVar66 = (ulong)((uint)uVar66 & (uint)uVar66 + 0xf & uVar65);
            goto LAB_0091eb94;
          }
          uVar67 = (int)uVar69 - 1;
          uVar70 = (ulong)uVar67;
          uVar64 = auStack_4b0[uVar70];
          fVar276 = afStack_340[uVar70 * 2];
          fVar277 = afStack_340[uVar70 * 2 + 1];
          auVar322._8_8_ = 0;
          auVar322._0_8_ = auStack_1a0[uVar70];
          auVar327 = ZEXT1664(auVar322);
          uVar6 = 0;
          if (uVar64 != 0) {
            for (; (uVar64 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar64 = uVar64 - 1 & uVar64;
          auStack_4b0[uVar70] = uVar64;
          if (uVar64 == 0) {
            uVar69 = (ulong)uVar67;
          }
          fVar192 = (float)(uVar6 + 1) * 0.14285715;
          fVar278 = (1.0 - (float)uVar6 * 0.14285715) * fVar276 +
                    fVar277 * (float)uVar6 * 0.14285715;
          fVar276 = (1.0 - fVar192) * fVar276 + fVar277 * fVar192;
          fVar277 = fVar276 - fVar278;
          if (0.16666667 <= fVar277) {
            auVar88 = vinsertps_avx(ZEXT416((uint)fVar278),ZEXT416((uint)fVar276),0x10);
            auVar367 = ZEXT1664(auVar88);
            goto LAB_0091f832;
          }
          auVar88 = vshufps_avx(auVar322,auVar322,0x50);
          auVar128._8_4_ = 0x3f800000;
          auVar128._0_8_ = 0x3f8000003f800000;
          auVar128._12_4_ = 0x3f800000;
          auVar199 = vsubps_avx(auVar128,auVar88);
          fVar192 = auVar88._0_4_;
          fVar213 = auVar88._4_4_;
          fVar214 = auVar88._8_4_;
          fVar215 = auVar88._12_4_;
          fVar216 = auVar199._0_4_;
          fVar239 = auVar199._4_4_;
          fVar240 = auVar199._8_4_;
          fVar241 = auVar199._12_4_;
          auVar171._0_4_ = fVar192 * auVar286._0_4_ + fVar216 * (float)local_710._0_4_;
          auVar171._4_4_ = fVar213 * auVar286._4_4_ + fVar239 * (float)local_710._4_4_;
          auVar171._8_4_ = fVar214 * auVar286._0_4_ + fVar240 * (float)local_710._0_4_;
          auVar171._12_4_ = fVar215 * auVar286._4_4_ + fVar241 * (float)local_710._4_4_;
          auVar228._0_4_ = auVar295._0_4_ * fVar192 + auVar344._0_4_ * fVar216;
          auVar228._4_4_ = auVar295._4_4_ * fVar213 + auVar344._4_4_ * fVar239;
          auVar228._8_4_ = auVar295._0_4_ * fVar214 + auVar344._0_4_ * fVar240;
          auVar228._12_4_ = auVar295._4_4_ * fVar215 + auVar344._4_4_ * fVar241;
          auVar247._0_4_ = auVar308._0_4_ * fVar192 + auVar355._0_4_ * fVar216;
          auVar247._4_4_ = auVar308._4_4_ * fVar213 + auVar355._4_4_ * fVar239;
          auVar247._8_4_ = auVar308._0_4_ * fVar214 + auVar355._0_4_ * fVar240;
          auVar247._12_4_ = auVar308._4_4_ * fVar215 + auVar355._4_4_ * fVar241;
          auVar96._0_4_ = auVar94._0_4_ * fVar192 + auVar127._0_4_ * fVar216;
          auVar96._4_4_ = auVar94._4_4_ * fVar213 + auVar127._4_4_ * fVar239;
          auVar96._8_4_ = auVar94._0_4_ * fVar214 + auVar127._0_4_ * fVar240;
          auVar96._12_4_ = auVar94._4_4_ * fVar215 + auVar127._4_4_ * fVar241;
          auVar148._16_16_ = auVar171;
          auVar148._0_16_ = auVar171;
          auVar189._16_16_ = auVar228;
          auVar189._0_16_ = auVar228;
          auVar238._16_16_ = auVar247;
          auVar238._0_16_ = auVar247;
          auVar110 = ZEXT2032(CONCAT416(fVar276,ZEXT416((uint)fVar278)));
          auVar110 = vshufps_avx(auVar110,auVar110,0);
          auVar18 = vsubps_avx(auVar189,auVar148);
          fVar192 = auVar110._0_4_;
          fVar213 = auVar110._4_4_;
          fVar214 = auVar110._8_4_;
          fVar215 = auVar110._12_4_;
          fVar216 = auVar110._16_4_;
          fVar239 = auVar110._20_4_;
          fVar240 = auVar110._24_4_;
          auVar149._0_4_ = auVar171._0_4_ + auVar18._0_4_ * fVar192;
          auVar149._4_4_ = auVar171._4_4_ + auVar18._4_4_ * fVar213;
          auVar149._8_4_ = auVar171._8_4_ + auVar18._8_4_ * fVar214;
          auVar149._12_4_ = auVar171._12_4_ + auVar18._12_4_ * fVar215;
          auVar149._16_4_ = auVar171._0_4_ + auVar18._16_4_ * fVar216;
          auVar149._20_4_ = auVar171._4_4_ + auVar18._20_4_ * fVar239;
          auVar149._24_4_ = auVar171._8_4_ + auVar18._24_4_ * fVar240;
          auVar149._28_4_ = auVar171._12_4_ + auVar18._28_4_;
          auVar110 = vsubps_avx(auVar238,auVar189);
          auVar190._0_4_ = auVar228._0_4_ + auVar110._0_4_ * fVar192;
          auVar190._4_4_ = auVar228._4_4_ + auVar110._4_4_ * fVar213;
          auVar190._8_4_ = auVar228._8_4_ + auVar110._8_4_ * fVar214;
          auVar190._12_4_ = auVar228._12_4_ + auVar110._12_4_ * fVar215;
          auVar190._16_4_ = auVar228._0_4_ + auVar110._16_4_ * fVar216;
          auVar190._20_4_ = auVar228._4_4_ + auVar110._20_4_ * fVar239;
          auVar190._24_4_ = auVar228._8_4_ + auVar110._24_4_ * fVar240;
          auVar190._28_4_ = auVar228._12_4_ + auVar110._28_4_;
          auVar88 = vsubps_avx(auVar96,auVar247);
          auVar114._0_4_ = auVar247._0_4_ + auVar88._0_4_ * fVar192;
          auVar114._4_4_ = auVar247._4_4_ + auVar88._4_4_ * fVar213;
          auVar114._8_4_ = auVar247._8_4_ + auVar88._8_4_ * fVar214;
          auVar114._12_4_ = auVar247._12_4_ + auVar88._12_4_ * fVar215;
          auVar114._16_4_ = auVar247._0_4_ + auVar88._0_4_ * fVar216;
          auVar114._20_4_ = auVar247._4_4_ + auVar88._4_4_ * fVar239;
          auVar114._24_4_ = auVar247._8_4_ + auVar88._8_4_ * fVar240;
          auVar114._28_4_ = auVar247._12_4_ + auVar88._12_4_;
          auVar110 = vsubps_avx(auVar190,auVar149);
          auVar150._0_4_ = auVar149._0_4_ + fVar192 * auVar110._0_4_;
          auVar150._4_4_ = auVar149._4_4_ + fVar213 * auVar110._4_4_;
          auVar150._8_4_ = auVar149._8_4_ + fVar214 * auVar110._8_4_;
          auVar150._12_4_ = auVar149._12_4_ + fVar215 * auVar110._12_4_;
          auVar150._16_4_ = auVar149._16_4_ + fVar216 * auVar110._16_4_;
          auVar150._20_4_ = auVar149._20_4_ + fVar239 * auVar110._20_4_;
          auVar150._24_4_ = auVar149._24_4_ + fVar240 * auVar110._24_4_;
          auVar150._28_4_ = auVar149._28_4_ + auVar110._28_4_;
          auVar110 = vsubps_avx(auVar114,auVar190);
          auVar115._0_4_ = auVar190._0_4_ + fVar192 * auVar110._0_4_;
          auVar115._4_4_ = auVar190._4_4_ + fVar213 * auVar110._4_4_;
          auVar115._8_4_ = auVar190._8_4_ + fVar214 * auVar110._8_4_;
          auVar115._12_4_ = auVar190._12_4_ + fVar215 * auVar110._12_4_;
          auVar115._16_4_ = auVar190._16_4_ + fVar216 * auVar110._16_4_;
          auVar115._20_4_ = auVar190._20_4_ + fVar239 * auVar110._20_4_;
          auVar115._24_4_ = auVar190._24_4_ + fVar240 * auVar110._24_4_;
          auVar115._28_4_ = auVar190._28_4_ + auVar110._28_4_;
          auVar110 = vsubps_avx(auVar115,auVar150);
          auVar262._0_4_ = auVar150._0_4_ + fVar192 * auVar110._0_4_;
          auVar262._4_4_ = auVar150._4_4_ + fVar213 * auVar110._4_4_;
          auVar262._8_4_ = auVar150._8_4_ + fVar214 * auVar110._8_4_;
          auVar262._12_4_ = auVar150._12_4_ + fVar215 * auVar110._12_4_;
          auVar266._16_4_ = auVar150._16_4_ + fVar216 * auVar110._16_4_;
          auVar266._0_16_ = auVar262;
          auVar266._20_4_ = auVar150._20_4_ + fVar239 * auVar110._20_4_;
          auVar266._24_4_ = auVar150._24_4_ + fVar240 * auVar110._24_4_;
          auVar266._28_4_ = auVar150._28_4_ + auVar190._28_4_;
          auVar87 = auVar266._16_16_;
          auVar130 = vshufps_avx(ZEXT416((uint)(fVar277 * 0.33333334)),
                                 ZEXT416((uint)(fVar277 * 0.33333334)),0);
          auVar229._0_4_ = auVar262._0_4_ + auVar130._0_4_ * auVar110._0_4_ * 3.0;
          auVar229._4_4_ = auVar262._4_4_ + auVar130._4_4_ * auVar110._4_4_ * 3.0;
          auVar229._8_4_ = auVar262._8_4_ + auVar130._8_4_ * auVar110._8_4_ * 3.0;
          auVar229._12_4_ = auVar262._12_4_ + auVar130._12_4_ * auVar110._12_4_ * 3.0;
          auVar187 = vshufpd_avx(auVar262,auVar262,3);
          auVar142 = vshufpd_avx(auVar87,auVar87,3);
          auVar88 = vsubps_avx(auVar187,auVar262);
          auVar199 = vsubps_avx(auVar142,auVar87);
          auVar97._0_4_ = auVar88._0_4_ + auVar199._0_4_;
          auVar97._4_4_ = auVar88._4_4_ + auVar199._4_4_;
          auVar97._8_4_ = auVar88._8_4_ + auVar199._8_4_;
          auVar97._12_4_ = auVar88._12_4_ + auVar199._12_4_;
          auVar88 = vmovshdup_avx(auVar262);
          auVar199 = vmovshdup_avx(auVar229);
          auVar173 = vshufps_avx(auVar97,auVar97,0);
          auVar131 = vshufps_avx(auVar97,auVar97,0x55);
          fVar192 = auVar131._0_4_;
          fVar213 = auVar131._4_4_;
          fVar214 = auVar131._8_4_;
          fVar215 = auVar131._12_4_;
          fVar216 = auVar173._0_4_;
          fVar239 = auVar173._4_4_;
          fVar240 = auVar173._8_4_;
          fVar241 = auVar173._12_4_;
          auVar98._0_4_ = fVar216 * auVar262._0_4_ + auVar88._0_4_ * fVar192;
          auVar98._4_4_ = fVar239 * auVar262._4_4_ + auVar88._4_4_ * fVar213;
          auVar98._8_4_ = fVar240 * auVar262._8_4_ + auVar88._8_4_ * fVar214;
          auVar98._12_4_ = fVar241 * auVar262._12_4_ + auVar88._12_4_ * fVar215;
          auVar323._0_4_ = fVar216 * auVar229._0_4_ + auVar199._0_4_ * fVar192;
          auVar323._4_4_ = fVar239 * auVar229._4_4_ + auVar199._4_4_ * fVar213;
          auVar323._8_4_ = fVar240 * auVar229._8_4_ + auVar199._8_4_ * fVar214;
          auVar323._12_4_ = fVar241 * auVar229._12_4_ + auVar199._12_4_ * fVar215;
          auVar199 = vshufps_avx(auVar98,auVar98,0xe8);
          auVar173 = vshufps_avx(auVar323,auVar323,0xe8);
          auVar88 = vcmpps_avx(auVar199,auVar173,1);
          uVar64 = vextractps_avx(auVar88,0);
          auVar131 = auVar323;
          if ((uVar64 & 1) == 0) {
            auVar131 = auVar98;
          }
          auVar129._0_4_ = auVar130._0_4_ * auVar110._16_4_ * 3.0;
          auVar129._4_4_ = auVar130._4_4_ * auVar110._20_4_ * 3.0;
          auVar129._8_4_ = auVar130._8_4_ * auVar110._24_4_ * 3.0;
          auVar129._12_4_ = auVar130._12_4_ * 0.0;
          auVar78 = vsubps_avx(auVar87,auVar129);
          auVar130 = vmovshdup_avx(auVar78);
          auVar87 = vmovshdup_avx(auVar87);
          fVar316 = auVar78._0_4_;
          fVar331 = auVar78._4_4_;
          auVar248._0_4_ = fVar316 * fVar216 + auVar130._0_4_ * fVar192;
          auVar248._4_4_ = fVar331 * fVar239 + auVar130._4_4_ * fVar213;
          auVar248._8_4_ = auVar78._8_4_ * fVar240 + auVar130._8_4_ * fVar214;
          auVar248._12_4_ = auVar78._12_4_ * fVar241 + auVar130._12_4_ * fVar215;
          auVar366._0_4_ = fVar216 * auVar266._16_4_ + auVar87._0_4_ * fVar192;
          auVar366._4_4_ = fVar239 * auVar266._20_4_ + auVar87._4_4_ * fVar213;
          auVar366._8_4_ = fVar240 * auVar266._24_4_ + auVar87._8_4_ * fVar214;
          auVar366._12_4_ = fVar241 * auVar266._28_4_ + auVar87._12_4_ * fVar215;
          auVar87 = vshufps_avx(auVar248,auVar248,0xe8);
          auVar272 = vshufps_avx(auVar366,auVar366,0xe8);
          auVar130 = vcmpps_avx(auVar87,auVar272,1);
          uVar64 = vextractps_avx(auVar130,0);
          auVar79 = auVar366;
          if ((uVar64 & 1) == 0) {
            auVar79 = auVar248;
          }
          auVar131 = vmaxss_avx(auVar79,auVar131);
          auVar199 = vminps_avx(auVar199,auVar173);
          auVar173 = vminps_avx(auVar87,auVar272);
          auVar173 = vminps_avx(auVar199,auVar173);
          auVar88 = vshufps_avx(auVar88,auVar88,0x55);
          auVar88 = vblendps_avx(auVar88,auVar130,2);
          auVar130 = vpslld_avx(auVar88,0x1f);
          auVar88 = vshufpd_avx(auVar323,auVar323,1);
          auVar88 = vinsertps_avx(auVar88,auVar366,0x9c);
          auVar199 = vshufpd_avx(auVar98,auVar98,1);
          auVar199 = vinsertps_avx(auVar199,auVar248,0x9c);
          auVar88 = vblendvps_avx(auVar199,auVar88,auVar130);
          auVar199 = vmovshdup_avx(auVar88);
          auVar88 = vmaxss_avx(auVar199,auVar88);
          fVar214 = auVar173._0_4_;
          auVar199 = vmovshdup_avx(auVar173);
          fVar213 = auVar88._0_4_;
          fVar215 = auVar199._0_4_;
          fVar192 = auVar131._0_4_;
          if ((fVar214 < 0.0001) && (-0.0001 < fVar213)) break;
          if ((fVar215 < 0.0001 && -0.0001 < fVar192) || (fVar214 < 0.0001 && -0.0001 < fVar192))
          break;
          auVar130 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar88,1);
          auVar199 = vcmpps_avx(auVar199,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar199 = vandps_avx(auVar199,auVar130);
        } while ((auVar199 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar130 = vcmpps_avx(auVar173,_DAT_01f45a50,1);
        auVar199 = vcmpss_avx(auVar131,ZEXT416(0) << 0x20,1);
        auVar172._8_4_ = 0x3f800000;
        auVar172._0_8_ = 0x3f8000003f800000;
        auVar172._12_4_ = 0x3f800000;
        auVar230._8_4_ = 0xbf800000;
        auVar230._0_8_ = 0xbf800000bf800000;
        auVar230._12_4_ = 0xbf800000;
        auVar199 = vblendvps_avx(auVar172,auVar230,auVar199);
        auVar130 = vblendvps_avx(auVar172,auVar230,auVar130);
        auVar173 = vcmpss_avx(auVar130,auVar199,4);
        auVar173 = vpshufd_avx(ZEXT416(auVar173._0_4_ & 1),0x50);
        auVar173 = vpslld_avx(auVar173,0x1f);
        auVar173 = vpsrad_avx(auVar173,0x1f);
        auVar173 = vpandn_avx(auVar173,_DAT_01f7afb0);
        auVar131 = vmovshdup_avx(auVar130);
        fVar216 = auVar131._0_4_;
        if ((auVar130._0_4_ != fVar216) || (NAN(auVar130._0_4_) || NAN(fVar216))) {
          if ((fVar215 != fVar214) || (NAN(fVar215) || NAN(fVar214))) {
            fVar214 = -fVar214 / (fVar215 - fVar214);
            auVar130 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar214) * 0.0 + fVar214)));
          }
          else {
            auVar130 = ZEXT816(0x3f80000000000000);
            if ((fVar214 != 0.0) || (NAN(fVar214))) {
              auVar130 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar87 = vcmpps_avx(auVar173,auVar130,1);
          auVar131 = vblendps_avx(auVar173,auVar130,2);
          auVar130 = vblendps_avx(auVar130,auVar173,2);
          auVar173 = vblendvps_avx(auVar130,auVar131,auVar87);
        }
        auVar88 = vcmpss_avx(auVar88,ZEXT416(0) << 0x20,1);
        auVar174._8_4_ = 0x3f800000;
        auVar174._0_8_ = 0x3f8000003f800000;
        auVar174._12_4_ = 0x3f800000;
        auVar231._8_4_ = 0xbf800000;
        auVar231._0_8_ = 0xbf800000bf800000;
        auVar231._12_4_ = 0xbf800000;
        auVar88 = vblendvps_avx(auVar174,auVar231,auVar88);
        fVar214 = auVar88._0_4_;
        if ((auVar199._0_4_ != fVar214) || (NAN(auVar199._0_4_) || NAN(fVar214))) {
          if ((fVar213 != fVar192) || (NAN(fVar213) || NAN(fVar192))) {
            fVar192 = -fVar192 / (fVar213 - fVar192);
            auVar88 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar192) * 0.0 + fVar192)));
          }
          else {
            auVar88 = ZEXT816(0x3f80000000000000);
            if ((fVar192 != 0.0) || (NAN(fVar192))) {
              auVar88 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar130 = vcmpps_avx(auVar173,auVar88,1);
          auVar199 = vblendps_avx(auVar173,auVar88,2);
          auVar88 = vblendps_avx(auVar88,auVar173,2);
          auVar173 = vblendvps_avx(auVar88,auVar199,auVar130);
        }
        if ((fVar216 != fVar214) || (NAN(fVar216) || NAN(fVar214))) {
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar88 = vcmpps_avx(auVar173,auVar99,1);
          auVar199 = vinsertps_avx(auVar173,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar175._4_12_ = auVar173._4_12_;
          auVar175._0_4_ = 0x3f800000;
          auVar173 = vblendvps_avx(auVar175,auVar199,auVar88);
        }
        auVar88 = vcmpps_avx(auVar173,_DAT_01f46740,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar173._4_12_;
        auVar199 = vinsertps_avx(auVar173,ZEXT416(0x3f800000),0x10);
        auVar88 = vblendvps_avx(auVar199,auVar54 << 0x20,auVar88);
        auVar199 = vmovshdup_avx(auVar88);
      } while (auVar199._0_4_ < auVar88._0_4_);
      auVar100._0_4_ = auVar88._0_4_ + -0.1;
      auVar100._4_4_ = auVar88._4_4_ + 0.1;
      auVar100._8_4_ = auVar88._8_4_ + 0.0;
      auVar100._12_4_ = auVar88._12_4_ + 0.0;
      auVar130 = vshufpd_avx(auVar229,auVar229,3);
      auVar263._8_8_ = 0x3f80000000000000;
      auVar263._0_8_ = 0x3f80000000000000;
      auVar88 = vcmpps_avx(auVar100,auVar263,1);
      auVar52._12_4_ = 0;
      auVar52._0_12_ = auVar100._4_12_;
      auVar199 = vinsertps_avx(auVar100,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar88 = vblendvps_avx(auVar199,auVar52 << 0x20,auVar88);
      auVar199 = vshufpd_avx(auVar78,auVar78,3);
      auVar173 = vshufps_avx(auVar88,auVar88,0x50);
      auVar264._8_4_ = 0x3f800000;
      auVar264._0_8_ = 0x3f8000003f800000;
      auVar264._12_4_ = 0x3f800000;
      auVar131 = vsubps_avx(auVar264,auVar173);
      local_5e0 = auVar187._0_4_;
      fStack_5dc = auVar187._4_4_;
      fStack_5d8 = auVar187._8_4_;
      fStack_5d4 = auVar187._12_4_;
      fVar192 = auVar173._0_4_;
      fVar213 = auVar173._4_4_;
      fVar214 = auVar173._8_4_;
      fVar215 = auVar173._12_4_;
      local_680 = auVar142._0_4_;
      fStack_67c = auVar142._4_4_;
      fStack_678 = auVar142._8_4_;
      fStack_674 = auVar142._12_4_;
      fVar216 = auVar131._0_4_;
      fVar239 = auVar131._4_4_;
      fVar240 = auVar131._8_4_;
      fVar241 = auVar131._12_4_;
      auVar101._0_4_ = fVar192 * local_5e0 + fVar216 * auVar262._0_4_;
      auVar101._4_4_ = fVar213 * fStack_5dc + fVar239 * auVar262._4_4_;
      auVar101._8_4_ = fVar214 * fStack_5d8 + fVar240 * auVar262._0_4_;
      auVar101._12_4_ = fVar215 * fStack_5d4 + fVar241 * auVar262._4_4_;
      auVar249._0_4_ = auVar130._0_4_ * fVar192 + fVar216 * auVar229._0_4_;
      auVar249._4_4_ = auVar130._4_4_ * fVar213 + fVar239 * auVar229._4_4_;
      auVar249._8_4_ = auVar130._8_4_ * fVar214 + fVar240 * auVar229._0_4_;
      auVar249._12_4_ = auVar130._12_4_ * fVar215 + fVar241 * auVar229._4_4_;
      auVar274._0_4_ = auVar199._0_4_ * fVar192 + fVar216 * fVar316;
      auVar274._4_4_ = auVar199._4_4_ * fVar213 + fVar239 * fVar331;
      auVar274._8_4_ = auVar199._8_4_ * fVar214 + fVar240 * fVar316;
      auVar274._12_4_ = auVar199._12_4_ * fVar215 + fVar241 * fVar331;
      auVar309._0_4_ = fVar192 * local_680 + fVar216 * auVar266._16_4_;
      auVar309._4_4_ = fVar213 * fStack_67c + fVar239 * auVar266._20_4_;
      auVar309._8_4_ = fVar214 * fStack_678 + fVar240 * auVar266._16_4_;
      auVar309._12_4_ = fVar215 * fStack_674 + fVar241 * auVar266._20_4_;
      auVar142 = vsubps_avx(auVar264,auVar88);
      auVar199 = vmovshdup_avx(auVar322);
      auVar187 = vmovsldup_avx(auVar322);
      auVar265._0_4_ = auVar142._0_4_ * auVar187._0_4_ + auVar88._0_4_ * auVar199._0_4_;
      auVar265._4_4_ = auVar142._4_4_ * auVar187._4_4_ + auVar88._4_4_ * auVar199._4_4_;
      auVar265._8_4_ = auVar142._8_4_ * auVar187._8_4_ + auVar88._8_4_ * auVar199._8_4_;
      auVar265._12_4_ = auVar142._12_4_ * auVar187._12_4_ + auVar88._12_4_ * auVar199._12_4_;
      auVar78 = vmovshdup_avx(auVar265);
      auVar88 = vsubps_avx(auVar249,auVar101);
      auVar176._0_4_ = auVar88._0_4_ * 3.0;
      auVar176._4_4_ = auVar88._4_4_ * 3.0;
      auVar176._8_4_ = auVar88._8_4_ * 3.0;
      auVar176._12_4_ = auVar88._12_4_ * 3.0;
      auVar88 = vsubps_avx(auVar274,auVar249);
      auVar209._0_4_ = auVar88._0_4_ * 3.0;
      auVar209._4_4_ = auVar88._4_4_ * 3.0;
      auVar209._8_4_ = auVar88._8_4_ * 3.0;
      auVar209._12_4_ = auVar88._12_4_ * 3.0;
      auVar88 = vsubps_avx(auVar309,auVar274);
      auVar287._0_4_ = auVar88._0_4_ * 3.0;
      auVar287._4_4_ = auVar88._4_4_ * 3.0;
      auVar287._8_4_ = auVar88._8_4_ * 3.0;
      auVar287._12_4_ = auVar88._12_4_ * 3.0;
      auVar199 = vminps_avx(auVar209,auVar287);
      auVar88 = vmaxps_avx(auVar209,auVar287);
      auVar199 = vminps_avx(auVar176,auVar199);
      auVar88 = vmaxps_avx(auVar176,auVar88);
      auVar187 = vshufpd_avx(auVar199,auVar199,3);
      auVar142 = vshufpd_avx(auVar88,auVar88,3);
      auVar199 = vminps_avx(auVar199,auVar187);
      auVar88 = vmaxps_avx(auVar88,auVar142);
      auVar187 = vshufps_avx(ZEXT416((uint)(1.0 / fVar277)),ZEXT416((uint)(1.0 / fVar277)),0);
      auVar288._0_4_ = auVar187._0_4_ * auVar199._0_4_;
      auVar288._4_4_ = auVar187._4_4_ * auVar199._4_4_;
      auVar288._8_4_ = auVar187._8_4_ * auVar199._8_4_;
      auVar288._12_4_ = auVar187._12_4_ * auVar199._12_4_;
      auVar296._0_4_ = auVar187._0_4_ * auVar88._0_4_;
      auVar296._4_4_ = auVar187._4_4_ * auVar88._4_4_;
      auVar296._8_4_ = auVar187._8_4_ * auVar88._8_4_;
      auVar296._12_4_ = auVar187._12_4_ * auVar88._12_4_;
      auVar131 = ZEXT416((uint)(1.0 / (auVar78._0_4_ - auVar265._0_4_)));
      auVar88 = vshufpd_avx(auVar101,auVar101,3);
      auVar199 = vshufpd_avx(auVar249,auVar249,3);
      auVar187 = vshufpd_avx(auVar274,auVar274,3);
      auVar142 = vshufpd_avx(auVar309,auVar309,3);
      auVar88 = vsubps_avx(auVar88,auVar101);
      auVar130 = vsubps_avx(auVar199,auVar249);
      auVar173 = vsubps_avx(auVar187,auVar274);
      auVar142 = vsubps_avx(auVar142,auVar309);
      auVar199 = vminps_avx(auVar88,auVar130);
      auVar88 = vmaxps_avx(auVar88,auVar130);
      auVar187 = vminps_avx(auVar173,auVar142);
      auVar187 = vminps_avx(auVar199,auVar187);
      auVar199 = vmaxps_avx(auVar173,auVar142);
      auVar88 = vmaxps_avx(auVar88,auVar199);
      auVar199 = vshufps_avx(auVar131,auVar131,0);
      auVar345._0_4_ = auVar199._0_4_ * auVar187._0_4_;
      auVar345._4_4_ = auVar199._4_4_ * auVar187._4_4_;
      auVar345._8_4_ = auVar199._8_4_ * auVar187._8_4_;
      auVar345._12_4_ = auVar199._12_4_ * auVar187._12_4_;
      auVar357._0_4_ = auVar199._0_4_ * auVar88._0_4_;
      auVar357._4_4_ = auVar199._4_4_ * auVar88._4_4_;
      auVar357._8_4_ = auVar199._8_4_ * auVar88._8_4_;
      auVar357._12_4_ = auVar199._12_4_ * auVar88._12_4_;
      auVar88 = vmovsldup_avx(auVar265);
      auVar310._4_12_ = auVar88._4_12_;
      auVar310._0_4_ = fVar278;
      auVar324._4_12_ = auVar265._4_12_;
      auVar324._0_4_ = fVar276;
      auVar210._0_4_ = (fVar278 + fVar276) * 0.5;
      auVar210._4_4_ = (auVar88._4_4_ + auVar265._4_4_) * 0.5;
      auVar210._8_4_ = (auVar88._8_4_ + auVar265._8_4_) * 0.5;
      auVar210._12_4_ = (auVar88._12_4_ + auVar265._12_4_) * 0.5;
      auVar88 = vshufps_avx(auVar210,auVar210,0);
      fVar192 = auVar88._0_4_;
      fVar213 = auVar88._4_4_;
      fVar214 = auVar88._8_4_;
      fVar215 = auVar88._12_4_;
      local_610 = auVar282._0_4_;
      fStack_60c = auVar282._4_4_;
      fStack_608 = auVar282._8_4_;
      fStack_604 = auVar282._12_4_;
      auVar132._0_4_ = fVar192 * (float)local_350._0_4_ + local_610;
      auVar132._4_4_ = fVar213 * (float)local_350._4_4_ + fStack_60c;
      auVar132._8_4_ = fVar214 * fStack_348 + fStack_608;
      auVar132._12_4_ = fVar215 * fStack_344 + fStack_604;
      local_620._0_4_ = auVar15._0_4_;
      local_620._4_4_ = auVar15._4_4_;
      fStack_618 = auVar15._8_4_;
      fStack_614 = auVar15._12_4_;
      auVar177._0_4_ = fVar192 * (float)local_360._0_4_ + (float)local_620._0_4_;
      auVar177._4_4_ = fVar213 * (float)local_360._4_4_ + (float)local_620._4_4_;
      auVar177._8_4_ = fVar214 * fStack_358 + fStack_618;
      auVar177._12_4_ = fVar215 * fStack_354 + fStack_614;
      local_630 = auVar168._0_4_;
      fStack_62c = auVar168._4_4_;
      fStack_628 = auVar168._8_4_;
      fStack_624 = auVar168._12_4_;
      auVar250._0_4_ = fVar192 * (float)local_370._0_4_ + local_630;
      auVar250._4_4_ = fVar213 * (float)local_370._4_4_ + fStack_62c;
      auVar250._8_4_ = fVar214 * fStack_368 + fStack_628;
      auVar250._12_4_ = fVar215 * fStack_364 + fStack_624;
      auVar88 = vsubps_avx(auVar177,auVar132);
      auVar133._0_4_ = auVar132._0_4_ + fVar192 * auVar88._0_4_;
      auVar133._4_4_ = auVar132._4_4_ + fVar213 * auVar88._4_4_;
      auVar133._8_4_ = auVar132._8_4_ + fVar214 * auVar88._8_4_;
      auVar133._12_4_ = auVar132._12_4_ + fVar215 * auVar88._12_4_;
      auVar88 = vsubps_avx(auVar250,auVar177);
      auVar178._0_4_ = auVar177._0_4_ + fVar192 * auVar88._0_4_;
      auVar178._4_4_ = auVar177._4_4_ + fVar213 * auVar88._4_4_;
      auVar178._8_4_ = auVar177._8_4_ + fVar214 * auVar88._8_4_;
      auVar178._12_4_ = auVar177._12_4_ + fVar215 * auVar88._12_4_;
      auVar88 = vsubps_avx(auVar178,auVar133);
      fVar192 = auVar133._0_4_ + fVar192 * auVar88._0_4_;
      fVar213 = auVar133._4_4_ + fVar213 * auVar88._4_4_;
      auVar102._0_8_ = CONCAT44(fVar213,fVar192);
      auVar102._8_4_ = auVar133._8_4_ + fVar214 * auVar88._8_4_;
      auVar102._12_4_ = auVar133._12_4_ + fVar215 * auVar88._12_4_;
      fVar214 = auVar88._0_4_ * 3.0;
      fVar215 = auVar88._4_4_ * 3.0;
      auVar134._0_8_ = CONCAT44(fVar215,fVar214);
      auVar134._8_4_ = auVar88._8_4_ * 3.0;
      auVar134._12_4_ = auVar88._12_4_ * 3.0;
      auVar179._8_8_ = auVar102._0_8_;
      auVar179._0_8_ = auVar102._0_8_;
      auVar88 = vshufpd_avx(auVar102,auVar102,3);
      auVar199 = vshufps_avx(auVar210,auVar210,0x55);
      auVar173 = vsubps_avx(auVar88,auVar179);
      auVar334._0_4_ = auVar173._0_4_ * auVar199._0_4_ + fVar192;
      auVar334._4_4_ = auVar173._4_4_ * auVar199._4_4_ + fVar213;
      auVar334._8_4_ = auVar173._8_4_ * auVar199._8_4_ + fVar192;
      auVar334._12_4_ = auVar173._12_4_ * auVar199._12_4_ + fVar213;
      auVar180._8_8_ = auVar134._0_8_;
      auVar180._0_8_ = auVar134._0_8_;
      auVar88 = vshufpd_avx(auVar134,auVar134,1);
      auVar88 = vsubps_avx(auVar88,auVar180);
      auVar135._0_4_ = auVar88._0_4_ * auVar199._0_4_ + fVar214;
      auVar135._4_4_ = auVar88._4_4_ * auVar199._4_4_ + fVar215;
      auVar135._8_4_ = auVar88._8_4_ * auVar199._8_4_ + fVar214;
      auVar135._12_4_ = auVar88._12_4_ * auVar199._12_4_ + fVar215;
      auVar199 = vmovshdup_avx(auVar135);
      auVar251._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
      auVar251._8_4_ = auVar199._8_4_ ^ 0x80000000;
      auVar251._12_4_ = auVar199._12_4_ ^ 0x80000000;
      auVar187 = vmovshdup_avx(auVar173);
      auVar88 = vunpcklps_avx(auVar187,auVar251);
      auVar142 = vshufps_avx(auVar88,auVar251,4);
      auVar103._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
      auVar103._8_4_ = -auVar173._8_4_;
      auVar103._12_4_ = -auVar173._12_4_;
      auVar88 = vmovlhps_avx(auVar103,auVar135);
      auVar130 = vshufps_avx(auVar88,auVar135,8);
      auVar88 = ZEXT416((uint)(auVar135._0_4_ * auVar187._0_4_ - auVar173._0_4_ * auVar199._0_4_));
      auVar199 = vshufps_avx(auVar88,auVar88,0);
      auVar88 = vdivps_avx(auVar142,auVar199);
      auVar199 = vdivps_avx(auVar130,auVar199);
      auVar130 = vinsertps_avx(auVar288,auVar345,0x1c);
      auVar173 = vinsertps_avx(auVar296,auVar357,0x1c);
      auVar131 = vinsertps_avx(auVar345,auVar288,0x4c);
      auVar87 = vinsertps_avx(auVar357,auVar296,0x4c);
      auVar187 = vmovsldup_avx(auVar88);
      auVar181._0_4_ = auVar187._0_4_ * auVar130._0_4_;
      auVar181._4_4_ = auVar187._4_4_ * auVar130._4_4_;
      auVar181._8_4_ = auVar187._8_4_ * auVar130._8_4_;
      auVar181._12_4_ = auVar187._12_4_ * auVar130._12_4_;
      auVar136._0_4_ = auVar173._0_4_ * auVar187._0_4_;
      auVar136._4_4_ = auVar173._4_4_ * auVar187._4_4_;
      auVar136._8_4_ = auVar173._8_4_ * auVar187._8_4_;
      auVar136._12_4_ = auVar173._12_4_ * auVar187._12_4_;
      auVar142 = vminps_avx(auVar181,auVar136);
      auVar187 = vmaxps_avx(auVar136,auVar181);
      auVar272 = vmovsldup_avx(auVar199);
      auVar358._0_4_ = auVar131._0_4_ * auVar272._0_4_;
      auVar358._4_4_ = auVar131._4_4_ * auVar272._4_4_;
      auVar358._8_4_ = auVar131._8_4_ * auVar272._8_4_;
      auVar358._12_4_ = auVar131._12_4_ * auVar272._12_4_;
      auVar182._0_4_ = auVar87._0_4_ * auVar272._0_4_;
      auVar182._4_4_ = auVar87._4_4_ * auVar272._4_4_;
      auVar182._8_4_ = auVar87._8_4_ * auVar272._8_4_;
      auVar182._12_4_ = auVar87._12_4_ * auVar272._12_4_;
      auVar272 = vminps_avx(auVar358,auVar182);
      auVar232._0_4_ = auVar142._0_4_ + auVar272._0_4_;
      auVar232._4_4_ = auVar142._4_4_ + auVar272._4_4_;
      auVar232._8_4_ = auVar142._8_4_ + auVar272._8_4_;
      auVar232._12_4_ = auVar142._12_4_ + auVar272._12_4_;
      auVar142 = vmaxps_avx(auVar182,auVar358);
      auVar272 = vsubps_avx(auVar310,auVar210);
      auVar79 = vsubps_avx(auVar324,auVar210);
      auVar137._0_4_ = auVar187._0_4_ + auVar142._0_4_;
      auVar137._4_4_ = auVar187._4_4_ + auVar142._4_4_;
      auVar137._8_4_ = auVar187._8_4_ + auVar142._8_4_;
      auVar137._12_4_ = auVar187._12_4_ + auVar142._12_4_;
      auVar183._8_8_ = 0x3f800000;
      auVar183._0_8_ = 0x3f800000;
      auVar187 = vsubps_avx(auVar183,auVar137);
      auVar142 = vsubps_avx(auVar183,auVar232);
      fVar240 = auVar272._0_4_;
      auVar233._0_4_ = fVar240 * auVar187._0_4_;
      fVar241 = auVar272._4_4_;
      auVar233._4_4_ = fVar241 * auVar187._4_4_;
      fVar316 = auVar272._8_4_;
      auVar233._8_4_ = fVar316 * auVar187._8_4_;
      fVar331 = auVar272._12_4_;
      auVar233._12_4_ = fVar331 * auVar187._12_4_;
      fVar214 = auVar79._0_4_;
      auVar138._0_4_ = fVar214 * auVar187._0_4_;
      fVar215 = auVar79._4_4_;
      auVar138._4_4_ = fVar215 * auVar187._4_4_;
      fVar216 = auVar79._8_4_;
      auVar138._8_4_ = fVar216 * auVar187._8_4_;
      fVar239 = auVar79._12_4_;
      auVar138._12_4_ = fVar239 * auVar187._12_4_;
      auVar311._0_4_ = fVar240 * auVar142._0_4_;
      auVar311._4_4_ = fVar241 * auVar142._4_4_;
      auVar311._8_4_ = fVar316 * auVar142._8_4_;
      auVar311._12_4_ = fVar331 * auVar142._12_4_;
      auVar184._0_4_ = fVar214 * auVar142._0_4_;
      auVar184._4_4_ = fVar215 * auVar142._4_4_;
      auVar184._8_4_ = fVar216 * auVar142._8_4_;
      auVar184._12_4_ = fVar239 * auVar142._12_4_;
      auVar187 = vminps_avx(auVar233,auVar311);
      auVar142 = vminps_avx(auVar138,auVar184);
      auVar272 = vminps_avx(auVar187,auVar142);
      auVar187 = vmaxps_avx(auVar311,auVar233);
      auVar142 = vmaxps_avx(auVar184,auVar138);
      auVar79 = vshufps_avx(auVar210,auVar210,0x54);
      auVar142 = vmaxps_avx(auVar142,auVar187);
      auVar118 = vshufps_avx(auVar334,auVar334,0);
      auVar157 = vshufps_avx(auVar334,auVar334,0x55);
      auVar187 = vhaddps_avx(auVar272,auVar272);
      auVar142 = vhaddps_avx(auVar142,auVar142);
      auVar211._0_4_ = auVar118._0_4_ * auVar88._0_4_ + auVar157._0_4_ * auVar199._0_4_;
      auVar211._4_4_ = auVar118._4_4_ * auVar88._4_4_ + auVar157._4_4_ * auVar199._4_4_;
      auVar211._8_4_ = auVar118._8_4_ * auVar88._8_4_ + auVar157._8_4_ * auVar199._8_4_;
      auVar211._12_4_ = auVar118._12_4_ * auVar88._12_4_ + auVar157._12_4_ * auVar199._12_4_;
      auVar272 = vsubps_avx(auVar79,auVar211);
      fVar192 = auVar272._0_4_ + auVar187._0_4_;
      fVar213 = auVar272._0_4_ + auVar142._0_4_;
      auVar187 = vmaxss_avx(ZEXT416((uint)fVar278),ZEXT416((uint)fVar192));
      auVar142 = vminss_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar276));
    } while (auVar142._0_4_ < auVar187._0_4_);
    auVar187 = vmovshdup_avx(auVar88);
    auVar104._0_4_ = auVar187._0_4_ * auVar130._0_4_;
    auVar104._4_4_ = auVar187._4_4_ * auVar130._4_4_;
    auVar104._8_4_ = auVar187._8_4_ * auVar130._8_4_;
    auVar104._12_4_ = auVar187._12_4_ * auVar130._12_4_;
    auVar139._0_4_ = auVar173._0_4_ * auVar187._0_4_;
    auVar139._4_4_ = auVar173._4_4_ * auVar187._4_4_;
    auVar139._8_4_ = auVar173._8_4_ * auVar187._8_4_;
    auVar139._12_4_ = auVar173._12_4_ * auVar187._12_4_;
    auVar142 = vminps_avx(auVar104,auVar139);
    auVar187 = vmaxps_avx(auVar139,auVar104);
    auVar130 = vmovshdup_avx(auVar199);
    auVar234._0_4_ = auVar131._0_4_ * auVar130._0_4_;
    auVar234._4_4_ = auVar131._4_4_ * auVar130._4_4_;
    auVar234._8_4_ = auVar131._8_4_ * auVar130._8_4_;
    auVar234._12_4_ = auVar131._12_4_ * auVar130._12_4_;
    auVar140._0_4_ = auVar87._0_4_ * auVar130._0_4_;
    auVar140._4_4_ = auVar87._4_4_ * auVar130._4_4_;
    auVar140._8_4_ = auVar87._8_4_ * auVar130._8_4_;
    auVar140._12_4_ = auVar87._12_4_ * auVar130._12_4_;
    auVar130 = vminps_avx(auVar234,auVar140);
    auVar185._0_4_ = auVar142._0_4_ + auVar130._0_4_;
    auVar185._4_4_ = auVar142._4_4_ + auVar130._4_4_;
    auVar185._8_4_ = auVar142._8_4_ + auVar130._8_4_;
    auVar185._12_4_ = auVar142._12_4_ + auVar130._12_4_;
    auVar142 = vmaxps_avx(auVar140,auVar234);
    auVar105._0_4_ = auVar187._0_4_ + auVar142._0_4_;
    auVar105._4_4_ = auVar187._4_4_ + auVar142._4_4_;
    auVar105._8_4_ = auVar187._8_4_ + auVar142._8_4_;
    auVar105._12_4_ = auVar187._12_4_ + auVar142._12_4_;
    auVar187 = vsubps_avx(auVar263,auVar105);
    auVar142 = vsubps_avx(auVar263,auVar185);
    auVar186._0_4_ = fVar240 * auVar187._0_4_;
    auVar186._4_4_ = fVar241 * auVar187._4_4_;
    auVar186._8_4_ = fVar316 * auVar187._8_4_;
    auVar186._12_4_ = fVar331 * auVar187._12_4_;
    auVar235._0_4_ = fVar240 * auVar142._0_4_;
    auVar235._4_4_ = fVar241 * auVar142._4_4_;
    auVar235._8_4_ = fVar316 * auVar142._8_4_;
    auVar235._12_4_ = fVar331 * auVar142._12_4_;
    auVar106._0_4_ = fVar214 * auVar187._0_4_;
    auVar106._4_4_ = fVar215 * auVar187._4_4_;
    auVar106._8_4_ = fVar216 * auVar187._8_4_;
    auVar106._12_4_ = fVar239 * auVar187._12_4_;
    auVar141._0_4_ = fVar214 * auVar142._0_4_;
    auVar141._4_4_ = fVar215 * auVar142._4_4_;
    auVar141._8_4_ = fVar216 * auVar142._8_4_;
    auVar141._12_4_ = fVar239 * auVar142._12_4_;
    auVar187 = vminps_avx(auVar186,auVar235);
    auVar142 = vminps_avx(auVar106,auVar141);
    auVar187 = vminps_avx(auVar187,auVar142);
    auVar142 = vmaxps_avx(auVar235,auVar186);
    auVar130 = vmaxps_avx(auVar141,auVar106);
    auVar187 = vhaddps_avx(auVar187,auVar187);
    auVar142 = vmaxps_avx(auVar130,auVar142);
    auVar142 = vhaddps_avx(auVar142,auVar142);
    auVar130 = vmovshdup_avx(auVar272);
    auVar173 = ZEXT416((uint)(auVar130._0_4_ + auVar187._0_4_));
    auVar187 = vmaxss_avx(auVar265,auVar173);
    auVar130 = ZEXT416((uint)(auVar130._0_4_ + auVar142._0_4_));
    auVar142 = vminss_avx(auVar130,auVar78);
  } while (auVar142._0_4_ < auVar187._0_4_);
  bVar71 = 0;
  if ((fVar278 < fVar192) && (fVar213 < fVar276)) {
    auVar187 = vcmpps_avx(auVar130,auVar78,1);
    auVar142 = vcmpps_avx(auVar265,auVar173,1);
    auVar187 = vandps_avx(auVar142,auVar187);
    bVar71 = auVar187[0];
  }
  auVar289._8_4_ = 0x7fffffff;
  auVar289._0_8_ = 0x7fffffff7fffffff;
  auVar289._12_4_ = 0x7fffffff;
  if (((uint)uVar69 < 4 && 0.001 <= fVar277) && (bVar71 & 1) == 0) goto LAB_00920e98;
  lVar68 = 0xc9;
  do {
    lVar68 = lVar68 + -1;
    if (lVar68 == 0) goto LAB_0091fe98;
    fVar277 = auVar272._0_4_;
    fVar276 = 1.0 - fVar277;
    auVar187 = ZEXT416((uint)(fVar276 * fVar276 * fVar276));
    auVar187 = vshufps_avx(auVar187,auVar187,0);
    auVar142 = ZEXT416((uint)(fVar277 * 3.0 * fVar276 * fVar276));
    auVar142 = vshufps_avx(auVar142,auVar142,0);
    auVar130 = ZEXT416((uint)(fVar276 * fVar277 * fVar277 * 3.0));
    auVar130 = vshufps_avx(auVar130,auVar130,0);
    auVar173 = ZEXT416((uint)(fVar277 * fVar277 * fVar277));
    auVar173 = vshufps_avx(auVar173,auVar173,0);
    fVar276 = local_610 * auVar187._0_4_ +
              (float)local_620._0_4_ * auVar142._0_4_ +
              (float)local_380._0_4_ * auVar173._0_4_ + local_630 * auVar130._0_4_;
    fVar277 = fStack_60c * auVar187._4_4_ +
              (float)local_620._4_4_ * auVar142._4_4_ +
              (float)local_380._4_4_ * auVar173._4_4_ + fStack_62c * auVar130._4_4_;
    auVar107._0_8_ = CONCAT44(fVar277,fVar276);
    auVar107._8_4_ =
         fStack_608 * auVar187._8_4_ +
         fStack_618 * auVar142._8_4_ + fStack_378 * auVar173._8_4_ + fStack_628 * auVar130._8_4_;
    auVar107._12_4_ =
         fStack_604 * auVar187._12_4_ +
         fStack_614 * auVar142._12_4_ + fStack_374 * auVar173._12_4_ + fStack_624 * auVar130._12_4_;
    auVar143._8_8_ = auVar107._0_8_;
    auVar143._0_8_ = auVar107._0_8_;
    auVar142 = vshufpd_avx(auVar107,auVar107,1);
    auVar187 = vmovshdup_avx(auVar272);
    auVar142 = vsubps_avx(auVar142,auVar143);
    auVar108._0_4_ = auVar187._0_4_ * auVar142._0_4_ + fVar276;
    auVar108._4_4_ = auVar187._4_4_ * auVar142._4_4_ + fVar277;
    auVar108._8_4_ = auVar187._8_4_ * auVar142._8_4_ + fVar276;
    auVar108._12_4_ = auVar187._12_4_ * auVar142._12_4_ + fVar277;
    auVar187 = vshufps_avx(auVar108,auVar108,0);
    auVar142 = vshufps_avx(auVar108,auVar108,0x55);
    auVar144._0_4_ = auVar88._0_4_ * auVar187._0_4_ + auVar199._0_4_ * auVar142._0_4_;
    auVar144._4_4_ = auVar88._4_4_ * auVar187._4_4_ + auVar199._4_4_ * auVar142._4_4_;
    auVar144._8_4_ = auVar88._8_4_ * auVar187._8_4_ + auVar199._8_4_ * auVar142._8_4_;
    auVar144._12_4_ = auVar88._12_4_ * auVar187._12_4_ + auVar199._12_4_ * auVar142._12_4_;
    auVar272 = vsubps_avx(auVar272,auVar144);
    auVar187 = vandps_avx(auVar289,auVar108);
    auVar142 = vshufps_avx(auVar187,auVar187,0xf5);
    auVar187 = vmaxss_avx(auVar142,auVar187);
  } while ((float)local_390._0_4_ <= auVar187._0_4_);
  fVar276 = auVar272._0_4_;
  if ((fVar276 < 0.0) || (1.0 < fVar276)) goto LAB_0091fe98;
  auVar88 = vmovshdup_avx(auVar272);
  fVar277 = auVar88._0_4_;
  if ((fVar277 < 0.0) || (1.0 < fVar277)) goto LAB_0091fe98;
  auVar88 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar87 = vinsertps_avx(auVar88,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar88 = vdpps_avx(auVar87,local_3a0,0x7f);
  auVar199 = vdpps_avx(auVar87,local_3b0,0x7f);
  auVar187 = vdpps_avx(auVar87,local_3e0,0x7f);
  auVar142 = vdpps_avx(auVar87,local_3f0,0x7f);
  auVar130 = vdpps_avx(auVar87,local_400,0x7f);
  auVar173 = vdpps_avx(auVar87,local_410,0x7f);
  fVar215 = 1.0 - fVar277;
  auVar131 = vdpps_avx(auVar87,local_3c0,0x7f);
  auVar87 = vdpps_avx(auVar87,local_3d0,0x7f);
  fVar216 = 1.0 - fVar276;
  fVar278 = auVar272._4_4_;
  fVar192 = auVar272._8_4_;
  fVar213 = auVar272._12_4_;
  fVar214 = fVar216 * fVar276 * fVar276 * 3.0;
  auVar252._0_4_ = fVar276 * fVar276 * fVar276;
  auVar252._4_4_ = fVar278 * fVar278 * fVar278;
  auVar252._8_4_ = fVar192 * fVar192 * fVar192;
  auVar252._12_4_ = fVar213 * fVar213 * fVar213;
  fVar278 = fVar276 * 3.0 * fVar216 * fVar216;
  fVar192 = fVar216 * fVar216 * fVar216;
  fVar276 = (fVar215 * auVar88._0_4_ + fVar277 * auVar187._0_4_) * fVar192 +
            (fVar215 * auVar199._0_4_ + fVar277 * auVar142._0_4_) * fVar278 +
            fVar214 * (fVar215 * auVar131._0_4_ + fVar277 * auVar130._0_4_) +
            auVar252._0_4_ * (auVar173._0_4_ * fVar277 + fVar215 * auVar87._0_4_);
  if ((fVar276 < fVar267) || (fVar277 = *(float *)(ray + k * 4 + 0x100), fVar277 < fVar276))
  goto LAB_0091fe98;
  pGVar8 = (context->scene->geometries).items[uVar65].ptr;
  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar71 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00920e7b;
    local_f0 = vshufps_avx(auVar272,auVar272,0x55);
    auVar290._8_4_ = 0x3f800000;
    auVar290._0_8_ = 0x3f8000003f800000;
    auVar290._12_4_ = 0x3f800000;
    auVar88 = vsubps_avx(auVar290,local_f0);
    fVar213 = local_f0._0_4_;
    fVar215 = local_f0._4_4_;
    fVar239 = local_f0._8_4_;
    fVar240 = local_f0._12_4_;
    fVar241 = auVar88._0_4_;
    fVar316 = auVar88._4_4_;
    fVar331 = auVar88._8_4_;
    fVar335 = auVar88._12_4_;
    auVar297._0_4_ = fVar213 * (float)local_4f0._0_4_ + fVar241 * (float)local_4c0._0_4_;
    auVar297._4_4_ = fVar215 * (float)local_4f0._4_4_ + fVar316 * (float)local_4c0._4_4_;
    auVar297._8_4_ = fVar239 * fStack_4e8 + fVar331 * fStack_4b8;
    auVar297._12_4_ = fVar240 * fStack_4e4 + fVar335 * fStack_4b4;
    auVar312._0_4_ = fVar213 * fVar153 + fVar241 * fVar152;
    auVar312._4_4_ = fVar215 * fVar155 + fVar316 * fVar154;
    auVar312._8_4_ = fVar239 * fVar329 + fVar331 * fVar328;
    auVar312._12_4_ = fVar240 * fVar314 + fVar335 * fVar303;
    auVar325._0_4_ = fVar213 * fVar76 + fVar241 * (float)local_4d0._0_4_;
    auVar325._4_4_ = fVar215 * fVar317 + fVar316 * (float)local_4d0._4_4_;
    auVar325._8_4_ = fVar239 * fVar330 + fVar331 * fStack_4c8;
    auVar325._12_4_ = fVar240 * fVar315 + fVar335 * fStack_4c4;
    auVar291._0_4_ = fVar213 * local_500 + fVar241 * (float)local_4e0._0_4_;
    auVar291._4_4_ = fVar215 * fStack_4fc + fVar316 * (float)local_4e0._4_4_;
    auVar291._8_4_ = fVar239 * fStack_4f8 + fVar331 * fStack_4d8;
    auVar291._12_4_ = fVar240 * fStack_4f4 + fVar335 * fStack_4d4;
    auVar142 = vsubps_avx(auVar312,auVar297);
    auVar130 = vsubps_avx(auVar325,auVar312);
    auVar173 = vsubps_avx(auVar291,auVar325);
    local_110 = vshufps_avx(auVar272,auVar272,0);
    fVar213 = local_110._0_4_;
    fVar239 = local_110._4_4_;
    fVar240 = local_110._8_4_;
    fVar316 = local_110._12_4_;
    auVar88 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
    fVar215 = auVar88._0_4_;
    fVar216 = auVar88._4_4_;
    fVar241 = auVar88._8_4_;
    fVar331 = auVar88._12_4_;
    auVar88 = vshufps_avx(auVar252,auVar252,0);
    auVar199 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
    auVar187 = vshufps_avx(ZEXT416((uint)fVar278),ZEXT416((uint)fVar278),0);
    auVar236._0_4_ =
         ((auVar130._0_4_ * fVar215 + auVar173._0_4_ * fVar213) * fVar213 +
         (auVar142._0_4_ * fVar215 + auVar130._0_4_ * fVar213) * fVar215) * 3.0;
    auVar236._4_4_ =
         ((auVar130._4_4_ * fVar216 + auVar173._4_4_ * fVar239) * fVar239 +
         (auVar142._4_4_ * fVar216 + auVar130._4_4_ * fVar239) * fVar216) * 3.0;
    auVar236._8_4_ =
         ((auVar130._8_4_ * fVar241 + auVar173._8_4_ * fVar240) * fVar240 +
         (auVar142._8_4_ * fVar241 + auVar130._8_4_ * fVar240) * fVar241) * 3.0;
    auVar236._12_4_ =
         ((auVar130._12_4_ * fVar331 + auVar173._12_4_ * fVar316) * fVar316 +
         (auVar142._12_4_ * fVar331 + auVar130._12_4_ * fVar316) * fVar331) * 3.0;
    auVar142 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
    auVar145._0_4_ =
         auVar142._0_4_ * (float)local_440._0_4_ +
         auVar187._0_4_ * (float)local_450._0_4_ +
         auVar88._0_4_ * (float)local_470._0_4_ + auVar199._0_4_ * (float)local_460._0_4_;
    auVar145._4_4_ =
         auVar142._4_4_ * (float)local_440._4_4_ +
         auVar187._4_4_ * (float)local_450._4_4_ +
         auVar88._4_4_ * (float)local_470._4_4_ + auVar199._4_4_ * (float)local_460._4_4_;
    auVar145._8_4_ =
         auVar142._8_4_ * fStack_438 +
         auVar187._8_4_ * fStack_448 + auVar88._8_4_ * fStack_468 + auVar199._8_4_ * fStack_458;
    auVar145._12_4_ =
         auVar142._12_4_ * fStack_434 +
         auVar187._12_4_ * fStack_444 + auVar88._12_4_ * fStack_464 + auVar199._12_4_ * fStack_454;
    auVar88 = vshufps_avx(auVar236,auVar236,0xc9);
    auVar188._0_4_ = auVar145._0_4_ * auVar88._0_4_;
    auVar188._4_4_ = auVar145._4_4_ * auVar88._4_4_;
    auVar188._8_4_ = auVar145._8_4_ * auVar88._8_4_;
    auVar188._12_4_ = auVar145._12_4_ * auVar88._12_4_;
    auVar88 = vshufps_avx(auVar145,auVar145,0xc9);
    auVar146._0_4_ = auVar236._0_4_ * auVar88._0_4_;
    auVar146._4_4_ = auVar236._4_4_ * auVar88._4_4_;
    auVar146._8_4_ = auVar236._8_4_ * auVar88._8_4_;
    auVar146._12_4_ = auVar236._12_4_ * auVar88._12_4_;
    auVar88 = vsubps_avx(auVar146,auVar188);
    local_170 = vshufps_avx(auVar88,auVar88,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar88,auVar88,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar88,auVar88,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_320._0_8_;
    uStack_d8 = local_320._8_8_;
    uStack_d0 = local_320._16_8_;
    uStack_c8 = local_320._24_8_;
    local_c0 = local_300;
    vcmpps_avx(local_300,local_300,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar276;
    local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar72 & 0xf) << 4));
    local_510 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar72 >> 4) * 0x10);
    local_4a0.valid = (int *)local_520;
    local_4a0.geometryUserPtr = pGVar8->userPtr;
    local_4a0.context = context->user;
    local_4a0.ray = (RTCRayN *)ray;
    local_4a0.hit = local_180;
    local_4a0.N = 8;
    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar8->occlusionFilterN)(&local_4a0);
    }
    auVar88 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
    auVar199 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
    auVar191._16_16_ = auVar199;
    auVar191._0_16_ = auVar88;
    auVar110 = _DAT_01f7b020 & ~auVar191;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar110 >> 0x7f,0) != '\0') ||
          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar110 >> 0xbf,0) != '\0') ||
        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar110[0x1f] < '\0') {
      p_Var11 = context->args->filter;
      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var11)(&local_4a0);
      }
      auVar88 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
      auVar199 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
      auVar116._16_16_ = auVar199;
      auVar116._0_16_ = auVar88;
      auVar151._8_4_ = 0xff800000;
      auVar151._0_8_ = 0xff800000ff800000;
      auVar151._12_4_ = 0xff800000;
      auVar151._16_4_ = 0xff800000;
      auVar151._20_4_ = 0xff800000;
      auVar151._24_4_ = 0xff800000;
      auVar151._28_4_ = 0xff800000;
      auVar110 = vblendvps_avx(auVar151,*(undefined1 (*) [32])(local_4a0.ray + 0x100),auVar116);
      *(undefined1 (*) [32])(local_4a0.ray + 0x100) = auVar110;
      auVar110 = _DAT_01f7b020 & ~auVar116;
      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0x7f,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar110 >> 0xbf,0) != '\0') ||
          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar110[0x1f] < '\0') {
        bVar71 = 1;
        goto LAB_00920e7b;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar277;
  }
  bVar71 = 0;
LAB_00920e7b:
  bVar75 = (bool)(bVar75 | bVar71);
  goto LAB_0091fe98;
LAB_00920e98:
  auVar88 = vinsertps_avx(ZEXT416((uint)fVar278),ZEXT416((uint)fVar276),0x10);
  auVar367 = ZEXT1664(auVar88);
  auVar327 = ZEXT1664(auVar265);
  goto LAB_0091f832;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }